

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_avx_functor::binary_op_rpow>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [24];
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [32];
  float *in_RDI;
  int in_R8D;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  __m128 _outp_1;
  __m128 _b_1;
  __m256 _outp;
  __m256 _b;
  __m256 _a_256;
  __m128 _a_128;
  int i;
  float a;
  binary_op_rpow op;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx;
  __m256 tmp_1;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  __m256i ret_1;
  __m128i y2;
  __m128i y1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf pow2n_1;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_3;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_3;
  v4sf y_2;
  v4sf z_1;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_2;
  v4si emm0;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2870;
  undefined8 uStack_2868;
  undefined8 local_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 local_27d0;
  undefined8 uStack_27c8;
  int local_27bc;
  float local_27b8;
  undefined1 local_27b1 [5];
  int local_27ac;
  float *local_27a8;
  undefined1 (*local_27a0) [32];
  undefined1 (*local_2790) [32];
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  float *local_2748;
  undefined1 (*local_2740) [32];
  undefined8 local_2730;
  undefined8 uStack_2728;
  float *local_2718;
  float local_2710;
  float fStack_270c;
  float fStack_2708;
  float fStack_2704;
  float local_26f4;
  undefined8 local_26f0;
  undefined8 uStack_26e8;
  undefined8 *local_26d8;
  undefined8 *local_26d0;
  undefined1 *local_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined1 local_2600 [32];
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined1 local_25a0 [8];
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [8];
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined1 local_23c0 [8];
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  float local_23a0;
  float fStack_239c;
  float fStack_2398;
  float fStack_2394;
  float fStack_2390;
  float fStack_238c;
  float fStack_2388;
  float fStack_2384;
  undefined1 local_2380 [32];
  undefined1 local_2360 [32];
  undefined1 local_2340 [8];
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined1 local_2320 [32];
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined1 local_22c0 [8];
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined1 local_21e0 [32];
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined1 *local_2018;
  float *local_2010;
  undefined1 *local_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  float local_1fe0;
  float fStack_1fdc;
  float fStack_1fd8;
  float fStack_1fd4;
  float fStack_1fd0;
  float fStack_1fcc;
  float fStack_1fc8;
  undefined4 uStack_1fc4;
  float local_1fc0 [2];
  float afStack_1fb8 [2];
  float afStack_1fb0 [2];
  float afStack_1fa8 [2];
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined1 *local_1f78;
  float *local_1f70;
  undefined1 *local_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  float local_1f40;
  float fStack_1f3c;
  float fStack_1f38;
  float fStack_1f34;
  float fStack_1f30;
  float fStack_1f2c;
  float fStack_1f28;
  undefined4 uStack_1f24;
  float local_1f20 [2];
  float afStack_1f18 [2];
  float afStack_1f10 [2];
  float afStack_1f08 [2];
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  float *local_1ed8;
  undefined1 *local_1ed0;
  undefined1 *local_1ec8;
  float local_1ec0 [2];
  float afStack_1eb8 [2];
  float afStack_1eb0 [2];
  float afStack_1ea8 [2];
  float local_1ea0;
  float fStack_1e9c;
  float fStack_1e98;
  float fStack_1e94;
  float fStack_1e90;
  float fStack_1e8c;
  float fStack_1e88;
  float fStack_1e84;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  float *local_1e38;
  undefined1 *local_1e30;
  undefined1 *local_1e28;
  float local_1e20 [2];
  float afStack_1e18 [2];
  float afStack_1e10 [2];
  float afStack_1e08 [2];
  float local_1e00;
  float fStack_1dfc;
  float fStack_1df8;
  float fStack_1df4;
  float fStack_1df0;
  float fStack_1dec;
  float fStack_1de8;
  float fStack_1de4;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  float *local_1d98;
  undefined1 *local_1d90;
  undefined1 *local_1d88;
  float local_1d80 [2];
  float afStack_1d78 [2];
  float afStack_1d70 [2];
  float afStack_1d68 [2];
  float local_1d60;
  float fStack_1d5c;
  float fStack_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  float fStack_1d48;
  float fStack_1d44;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  float *local_1cf8;
  undefined1 *local_1cf0;
  undefined1 *local_1ce8;
  float local_1ce0 [2];
  float afStack_1cd8 [2];
  float afStack_1cd0 [2];
  float afStack_1cc8 [2];
  float local_1cc0;
  float fStack_1cbc;
  float fStack_1cb8;
  float fStack_1cb4;
  float fStack_1cb0;
  float fStack_1cac;
  float fStack_1ca8;
  float fStack_1ca4;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  float *local_1c58;
  undefined1 *local_1c50;
  undefined1 *local_1c48;
  float local_1c40 [2];
  float afStack_1c38 [2];
  float afStack_1c30 [2];
  float afStack_1c28 [2];
  float local_1c20;
  float fStack_1c1c;
  float fStack_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  float fStack_1c08;
  float fStack_1c04;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  float *local_1bb8;
  undefined1 *local_1bb0;
  undefined1 *local_1ba8;
  float local_1ba0 [2];
  float afStack_1b98 [2];
  float afStack_1b90 [2];
  float afStack_1b88 [2];
  float local_1b80;
  float fStack_1b7c;
  float fStack_1b78;
  float fStack_1b74;
  float fStack_1b70;
  float fStack_1b6c;
  float fStack_1b68;
  float fStack_1b64;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  float *local_1b18;
  undefined1 *local_1b10;
  undefined1 *local_1b08;
  float local_1b00 [2];
  float afStack_1af8 [2];
  float afStack_1af0 [2];
  float afStack_1ae8 [2];
  float local_1ae0;
  float fStack_1adc;
  float fStack_1ad8;
  float fStack_1ad4;
  float fStack_1ad0;
  float fStack_1acc;
  float fStack_1ac8;
  float fStack_1ac4;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  float *local_1a78;
  undefined1 *local_1a70;
  undefined1 *local_1a68;
  float local_1a60 [2];
  float afStack_1a58 [2];
  float afStack_1a50 [2];
  float afStack_1a48 [2];
  float local_1a40;
  float fStack_1a3c;
  float fStack_1a38;
  float fStack_1a34;
  float fStack_1a30;
  float fStack_1a2c;
  float fStack_1a28;
  float fStack_1a24;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined1 *local_19d8;
  undefined8 *local_19d0;
  undefined8 *local_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  float local_19a0;
  float fStack_199c;
  float fStack_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  float fStack_1988;
  float fStack_1984;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  float *local_1938;
  undefined1 *local_1930;
  undefined8 *local_1928;
  float local_1920 [2];
  float afStack_1918 [2];
  float afStack_1910 [2];
  float afStack_1908 [2];
  float local_1900;
  float fStack_18fc;
  float fStack_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  float fStack_18e8;
  float fStack_18e4;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  float *local_1898;
  undefined1 *local_1890;
  undefined8 *local_1888;
  float local_1880 [2];
  float afStack_1878 [2];
  float afStack_1870 [2];
  float afStack_1868 [2];
  float local_1860;
  float fStack_185c;
  float fStack_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float fStack_1848;
  float fStack_1844;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  float *local_17f8;
  undefined1 *local_17f0;
  undefined8 *local_17e8;
  float local_17e0 [2];
  float afStack_17d8 [2];
  float afStack_17d0 [2];
  float afStack_17c8 [2];
  float local_17c0;
  float fStack_17bc;
  float fStack_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float fStack_17a8;
  float fStack_17a4;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  float *local_1758;
  undefined1 *local_1750;
  undefined8 *local_1748;
  float local_1740 [2];
  float afStack_1738 [2];
  float afStack_1730 [2];
  float afStack_1728 [2];
  float local_1720;
  float fStack_171c;
  float fStack_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  float *local_16b8;
  undefined1 *local_16b0;
  undefined8 *local_16a8;
  float local_16a0 [2];
  float afStack_1698 [2];
  float afStack_1690 [2];
  float afStack_1688 [2];
  float local_1680;
  float fStack_167c;
  float fStack_1678;
  float fStack_1674;
  float fStack_1670;
  float fStack_166c;
  float fStack_1668;
  float fStack_1664;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  float *local_1618;
  float *local_1610;
  undefined1 *local_1608;
  float local_1600 [2];
  float afStack_15f8 [2];
  float afStack_15f0 [2];
  float afStack_15e8 [2];
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  undefined4 uStack_15c4;
  float local_15c0 [2];
  float afStack_15b8 [2];
  float afStack_15b0 [2];
  float afStack_15a8 [2];
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined1 *local_1478;
  float *local_1470;
  float *local_1468;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  float local_1420 [2];
  float afStack_1418 [2];
  float afStack_1410 [2];
  float afStack_1408 [2];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined1 *local_13d8;
  float *local_13d0;
  undefined1 *local_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  float local_1380 [2];
  float afStack_1378 [2];
  float afStack_1370 [2];
  float afStack_1368 [2];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined1 *local_1338;
  float *local_1330;
  undefined1 *local_1328;
  float local_1320;
  float fStack_131c;
  float fStack_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float fStack_1308;
  float fStack_1304;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  float local_12e0 [2];
  float afStack_12d8 [2];
  float afStack_12d0 [2];
  float afStack_12c8 [2];
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 local_11f0;
  undefined8 uStack_11e8;
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined4 local_10e4;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 local_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 local_1070;
  undefined8 uStack_1068;
  undefined4 local_1054;
  undefined8 local_1050;
  undefined8 uStack_1048;
  undefined4 local_1034;
  undefined8 local_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined1 local_fb0 [16];
  undefined1 local_fa0 [16];
  undefined4 local_f84;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 local_e30;
  undefined8 uStack_e28;
  undefined1 local_e20 [16];
  undefined1 local_e10 [16];
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined4 local_d94;
  undefined8 local_d90;
  undefined8 uStack_d88;
  undefined4 local_d74;
  undefined8 local_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined8 *local_d18;
  undefined8 *local_d10;
  undefined1 *local_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 local_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 local_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 local_cb0;
  undefined8 uStack_ca8;
  undefined1 local_ca0 [16];
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined1 local_c80 [16];
  undefined1 local_c70 [8];
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined1 local_c50 [8];
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 local_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 local_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined4 local_b14;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [8];
  undefined8 uStack_af8;
  float local_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [8];
  undefined8 uStack_ab8;
  undefined1 local_ab0 [16];
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined1 local_a90 [16];
  undefined1 local_a80 [8];
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined1 local_a10 [16];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined4 local_944;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined1 *local_808;
  float *local_800;
  float *local_7f8;
  float local_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  float local_7d0 [2];
  float afStack_7c8 [2];
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined1 *local_7a8;
  float *local_7a0;
  undefined1 *local_798;
  float local_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined8 local_780;
  undefined8 uStack_778;
  float local_770 [2];
  float afStack_768 [2];
  undefined8 local_760;
  undefined8 uStack_758;
  undefined1 *local_748;
  float *local_740;
  undefined1 *local_738;
  float local_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined8 local_720;
  undefined8 uStack_718;
  float local_710 [2];
  float afStack_708 [2];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined1 *local_6e8;
  float *local_6e0;
  undefined1 *local_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float local_6b0 [2];
  float afStack_6a8 [2];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined1 *local_688;
  float *local_680;
  undefined1 *local_678;
  undefined8 local_670;
  undefined8 uStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float local_650 [2];
  float afStack_648 [2];
  undefined8 local_640;
  undefined8 uStack_638;
  float *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  float local_610 [2];
  float afStack_608 [2];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  float *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  float local_5b0 [2];
  float afStack_5a8 [2];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  float *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  float local_550 [2];
  float afStack_548 [2];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  float *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  float local_4f0 [2];
  float afStack_4e8 [2];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  float *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  float local_490 [2];
  float afStack_488 [2];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  float *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  float local_430 [2];
  float afStack_428 [2];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  float *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  float local_3d0 [2];
  float afStack_3c8 [2];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  float *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  float local_370 [2];
  float afStack_368 [2];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined1 *local_328;
  undefined8 *local_320;
  undefined8 *local_318;
  undefined8 local_310;
  undefined8 uStack_308;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  float *local_2c8;
  undefined1 *local_2c0;
  undefined8 *local_2b8;
  float local_2b0 [2];
  float afStack_2a8 [2];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  float *local_268;
  undefined1 *local_260;
  undefined8 *local_258;
  float local_250 [2];
  float afStack_248 [2];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float *local_208;
  undefined1 *local_200;
  undefined8 *local_1f8;
  float local_1f0 [2];
  float afStack_1e8 [2];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float *local_1a8;
  undefined1 *local_1a0;
  undefined8 *local_198;
  float local_190 [2];
  float afStack_188 [2];
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  float *local_148;
  undefined1 *local_140;
  undefined8 *local_138;
  float local_130 [2];
  float afStack_128 [2];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 (*local_48) [32];
  float *local_40;
  undefined1 *local_38;
  
  local_27b8 = *in_RDI;
  local_27bc = 0;
  if (in_R8D == 4) {
    local_2870 = *(undefined8 *)in_RDI;
    uStack_2868 = *(undefined8 *)(in_RDI + 2);
  }
  else {
    local_2870 = CONCAT44(local_27b8,local_27b8);
    uStack_2868 = CONCAT44(local_27b8,local_27b8);
    local_2710 = local_27b8;
    fStack_270c = local_27b8;
    fStack_2708 = local_27b8;
    fStack_2704 = local_27b8;
    local_26f4 = local_27b8;
  }
  local_27d0 = local_2870;
  uStack_27c8 = uStack_2868;
  if (in_R8D == 8) {
    local_28a0 = *(undefined8 *)in_RDI;
    uStack_2898 = *(undefined8 *)(in_RDI + 2);
    uStack_2890 = *(undefined8 *)(in_RDI + 4);
    uStack_2888 = *(undefined8 *)(in_RDI + 6);
  }
  else {
    local_26f0 = local_2870;
    uStack_26e8 = uStack_2868;
    local_28a0 = local_2870;
    uStack_2898 = uStack_2868;
    uStack_2890 = local_2870;
    uStack_2888 = uStack_2868;
  }
  local_2800 = local_28a0;
  uStack_27f8 = uStack_2898;
  uStack_27f0 = uStack_2890;
  uStack_27e8 = uStack_2888;
  local_27a8 = in_RDX;
  local_27a0 = in_RSI;
  for (; local_27bc + 7 < in_ECX; local_27bc = local_27bc + 8) {
    local_2790 = local_27a0;
    local_2820 = *(undefined8 *)*local_27a0;
    uStack_2818 = *(undefined8 *)(*local_27a0 + 8);
    uStack_2810 = *(undefined8 *)(*local_27a0 + 0x10);
    uStack_2808 = *(undefined8 *)(*local_27a0 + 0x18);
    local_26c8 = local_27b1;
    local_26d0 = &local_2800;
    local_26d8 = &local_2820;
    local_26c0 = local_28a0;
    uStack_26b8 = uStack_2898;
    uStack_26b0 = uStack_2890;
    uStack_26a8 = uStack_2888;
    local_25e0 = 0x3f8000003f800000;
    uStack_25d8 = 0x3f8000003f800000;
    uStack_25d0 = 0x3f8000003f800000;
    uStack_25c8 = 0x3f8000003f800000;
    local_2060 = 0;
    uStack_2058 = 0;
    uStack_2050 = 0;
    uStack_2048 = 0;
    local_2320 = vcmpps_avx(*local_27a0,ZEXT1632(ZEXT816(0)),2);
    local_22c0 = SUB168(*(undefined1 (*) [16])*local_27a0,0);
    local_2080 = local_22c0;
    uStack_22b8 = SUB168(*(undefined1 (*) [16])*local_27a0,8);
    uStack_2078 = uStack_22b8;
    local_20a0 = 0x80000000800000;
    uStack_2098 = 0x80000000800000;
    uStack_2090 = 0x80000000800000;
    uStack_2088 = 0x80000000800000;
    auVar25._8_8_ = 0x80000000800000;
    auVar25._0_8_ = 0x80000000800000;
    auVar25._16_8_ = 0x80000000800000;
    auVar25._24_8_ = 0x80000000800000;
    auVar2 = vmaxps_avx(*local_27a0,auVar25);
    local_22c0 = auVar2._0_8_;
    local_f60 = local_22c0;
    uStack_22b8 = auVar2._8_8_;
    uStack_f58 = uStack_22b8;
    uStack_22b0 = auVar2._16_8_;
    uStack_f50 = uStack_22b0;
    uStack_22a8 = auVar2._24_8_;
    uStack_f48 = uStack_22a8;
    local_f80 = local_22c0;
    uStack_f78 = uStack_22b8;
    uStack_f70 = uStack_22b0;
    uStack_f68 = uStack_22a8;
    local_f84 = 0x17;
    local_1000 = local_22c0;
    uStack_ff8 = uStack_22b8;
    uStack_ff0 = uStack_22b0;
    uStack_fe8 = uStack_22a8;
    local_d70 = local_22c0;
    uStack_d68 = uStack_22b8;
    local_d74 = 0x17;
    local_fa0 = vpsrld_avx(auVar2._0_16_,ZEXT416(0x17));
    local_d90 = uStack_22b0;
    uStack_d88 = uStack_22a8;
    local_d94 = 0x17;
    local_fb0 = vpsrld_avx(auVar2._16_16_,ZEXT416(0x17));
    local_1020 = local_fa0._0_8_;
    uStack_1018 = local_fa0._8_8_;
    uStack_1010 = local_fb0._0_8_;
    uStack_1008 = local_fb0._8_8_;
    local_fe0 = local_fa0._0_8_;
    uStack_fd8 = local_fa0._8_8_;
    uStack_fd0 = local_fb0._0_8_;
    uStack_fc8 = local_fb0._8_8_;
    local_14e0 = local_22c0;
    uStack_14d8 = uStack_22b8;
    uStack_14d0 = uStack_22b0;
    uStack_14c8 = uStack_22a8;
    local_1500 = 0x807fffff807fffff;
    uStack_14f8 = 0x807fffff807fffff;
    uStack_14f0 = 0x807fffff807fffff;
    uStack_14e8 = 0x807fffff807fffff;
    auVar27._8_8_ = 0x807fffff807fffff;
    auVar27._0_8_ = 0x807fffff807fffff;
    auVar27._16_8_ = 0x807fffff807fffff;
    auVar27._24_8_ = 0x807fffff807fffff;
    auVar2 = vandps_avx(auVar2,auVar27);
    local_22c0 = auVar2._0_8_;
    local_ee0 = local_22c0;
    uStack_22b8 = auVar2._8_8_;
    uStack_ed8 = uStack_22b8;
    uStack_22b0 = auVar2._16_8_;
    uStack_ed0 = uStack_22b0;
    uStack_22a8 = auVar2._24_8_;
    uStack_ec8 = uStack_22a8;
    local_f00 = 0x3f0000003f000000;
    uStack_ef8 = 0x3f0000003f000000;
    uStack_ef0 = 0x3f0000003f000000;
    uStack_ee8 = 0x3f0000003f000000;
    auVar34._8_8_ = 0x3f0000003f000000;
    auVar34._0_8_ = 0x3f0000003f000000;
    auVar34._16_8_ = 0x3f0000003f000000;
    auVar34._24_8_ = 0x3f0000003f000000;
    auVar3 = vorps_avx(auVar2,auVar34);
    local_de0 = local_fa0._0_8_;
    uStack_dd8 = local_fa0._8_8_;
    uStack_dd0 = local_fb0._0_8_;
    uStack_dc8 = local_fb0._8_8_;
    local_11c0 = 0x7f0000007f;
    uStack_11b8 = 0x7f0000007f;
    uStack_11b0 = 0x7f0000007f;
    uStack_11a8 = 0x7f0000007f;
    local_e80 = local_fa0._0_8_;
    uStack_e78 = local_fa0._8_8_;
    uStack_e70 = local_fb0._0_8_;
    uStack_e68 = local_fb0._8_8_;
    local_ea0 = 0x7f0000007f;
    uStack_e98 = 0x7f0000007f;
    uStack_e90 = 0x7f0000007f;
    uStack_e88 = 0x7f0000007f;
    local_e30 = 0x7f0000007f;
    uStack_e28 = 0x7f0000007f;
    local_e40 = 0x7f0000007f;
    uStack_e38 = 0x7f0000007f;
    local_d30 = local_fa0._0_8_;
    uStack_d28 = local_fa0._8_8_;
    local_d40 = 0x7f0000007f;
    uStack_d38 = 0x7f0000007f;
    auVar37._8_8_ = 0x7f0000007f;
    auVar37._0_8_ = 0x7f0000007f;
    local_e10 = vpsubd_avx(local_fa0,auVar37);
    local_d50 = local_fb0._0_8_;
    uStack_d48 = local_fb0._8_8_;
    local_d60 = 0x7f0000007f;
    uStack_d58 = 0x7f0000007f;
    auVar36._8_8_ = 0x7f0000007f;
    auVar36._0_8_ = 0x7f0000007f;
    local_e20 = vpsubd_avx(local_fb0,auVar36);
    local_ec0 = local_e10._0_8_;
    uStack_eb8 = local_e10._8_8_;
    uStack_eb0 = local_e20._0_8_;
    uStack_ea8 = local_e20._8_8_;
    local_e60 = local_e10._0_8_;
    uStack_e58 = local_e10._8_8_;
    uStack_e50 = local_e20._0_8_;
    uStack_e48 = local_e20._8_8_;
    local_22e0 = local_e10._0_8_;
    uStack_22d8 = local_e10._8_8_;
    uStack_22d0 = local_e20._0_8_;
    uStack_22c8 = local_e20._8_8_;
    local_dc0 = local_e10._0_8_;
    uStack_db8 = local_e10._8_8_;
    uStack_db0 = local_e20._0_8_;
    uStack_da8 = local_e20._8_8_;
    auVar35._16_8_ = local_e20._0_8_;
    auVar35._0_16_ = local_e10;
    auVar35._24_8_ = local_e20._8_8_;
    auVar2 = vcvtdq2ps_avx(auVar35);
    local_2340 = auVar2._0_8_;
    uVar7 = local_2340;
    uStack_2338 = auVar2._8_8_;
    uVar8 = uStack_2338;
    uStack_2330 = auVar2._16_8_;
    uVar9 = uStack_2330;
    uStack_2328 = auVar2._24_8_;
    uVar10 = uStack_2328;
    local_2220 = 0x3f8000003f800000;
    uStack_2218 = 0x3f8000003f800000;
    uStack_2210 = 0x3f8000003f800000;
    uStack_2208 = 0x3f8000003f800000;
    local_2200._0_4_ = auVar2._0_4_;
    local_2200._4_4_ = auVar2._4_4_;
    uStack_21f8._0_4_ = auVar2._8_4_;
    uStack_21f8._4_4_ = auVar2._12_4_;
    uStack_21f0._0_4_ = auVar2._16_4_;
    uStack_21f0._4_4_ = auVar2._20_4_;
    uStack_21e8._0_4_ = auVar2._24_4_;
    uStack_21e8._4_4_ = auVar2._28_4_;
    local_2340._4_4_ = local_2200._4_4_ + 1.0;
    local_2340._0_4_ = (float)local_2200 + 1.0;
    uStack_2338._0_4_ = (float)uStack_21f8 + 1.0;
    uStack_2338._4_4_ = uStack_21f8._4_4_ + 1.0;
    uStack_2330._0_4_ = (float)uStack_21f0 + 1.0;
    uStack_2330._4_4_ = uStack_21f0._4_4_ + 1.0;
    auVar58 = _local_2340;
    uStack_2328._0_4_ = (float)uStack_21e8 + 1.0;
    uStack_2328._4_4_ = uStack_21e8._4_4_ + 1.0;
    auVar6 = _local_2340;
    local_2360 = vcmpps_avx(auVar3,_DAT_01f8f6e0,1);
    local_22c0 = auVar3._0_8_;
    local_1520 = local_22c0;
    uStack_22b8 = auVar3._8_8_;
    uStack_1518 = uStack_22b8;
    uStack_22b0 = auVar3._16_8_;
    uStack_1510 = uStack_22b0;
    uStack_22a8 = auVar3._24_8_;
    uStack_1508 = uStack_22a8;
    local_1540 = local_2360._0_8_;
    uStack_1538 = local_2360._8_8_;
    uStack_1530 = local_2360._16_8_;
    uStack_1528 = local_2360._24_8_;
    local_2380 = vandps_avx(auVar3,local_2360);
    local_2180 = local_22c0;
    uStack_2178 = uStack_22b8;
    uStack_2170 = uStack_22b0;
    uStack_2168 = uStack_22a8;
    local_21a0 = 0x3f8000003f800000;
    uStack_2198 = 0x3f8000003f800000;
    uStack_2190 = 0x3f8000003f800000;
    uStack_2188 = 0x3f8000003f800000;
    auVar24._8_8_ = 0x3f8000003f800000;
    auVar24._0_8_ = 0x3f8000003f800000;
    auVar24._16_8_ = 0x3f8000003f800000;
    auVar24._24_8_ = 0x3f8000003f800000;
    auVar2 = vsubps_avx(auVar3,auVar24);
    local_21c0 = local_2340;
    uStack_21b8 = uStack_2338;
    uStack_2330 = auVar58._16_8_;
    uStack_21b0 = uStack_2330;
    uStack_2328 = auVar6._24_8_;
    uStack_21a8 = uStack_2328;
    local_1560 = 0x3f8000003f800000;
    uStack_1558 = 0x3f8000003f800000;
    uStack_1550 = 0x3f8000003f800000;
    uStack_1548 = 0x3f8000003f800000;
    local_1580 = local_2360._0_8_;
    uStack_1578 = local_2360._8_8_;
    uStack_1570 = local_2360._16_8_;
    uStack_1568 = local_2360._24_8_;
    auVar26._8_8_ = 0x3f8000003f800000;
    auVar26._0_8_ = 0x3f8000003f800000;
    auVar26._16_8_ = 0x3f8000003f800000;
    auVar26._24_8_ = 0x3f8000003f800000;
    local_21e0 = vandps_avx(auVar26,local_2360);
    auVar23._16_8_ = uStack_2330;
    auVar23._0_16_ = _local_2340;
    auVar23._24_8_ = uStack_2328;
    _local_2340 = vsubps_avx(auVar23,local_21e0);
    local_22c0 = auVar2._0_8_;
    uVar11 = local_22c0;
    uStack_22b8 = auVar2._8_8_;
    uVar12 = uStack_22b8;
    uStack_22b0 = auVar2._16_8_;
    uVar13 = uStack_22b0;
    uStack_22a8 = auVar2._24_8_;
    uVar14 = uStack_22a8;
    local_2240._0_4_ = auVar2._0_4_;
    local_2240._4_4_ = auVar2._4_4_;
    uStack_2238._0_4_ = auVar2._8_4_;
    uStack_2238._4_4_ = auVar2._12_4_;
    uStack_2230._0_4_ = auVar2._16_4_;
    uStack_2230._4_4_ = auVar2._20_4_;
    uStack_2228._0_4_ = auVar2._24_4_;
    uStack_2228._4_4_ = auVar2._28_4_;
    local_2260._0_4_ = local_2380._0_4_;
    local_2260._4_4_ = local_2380._4_4_;
    uStack_2258._0_4_ = local_2380._8_4_;
    uStack_2258._4_4_ = local_2380._12_4_;
    uStack_2250._0_4_ = local_2380._16_4_;
    uStack_2250._4_4_ = local_2380._20_4_;
    uStack_2248._0_4_ = local_2380._24_4_;
    uStack_2248._4_4_ = local_2380._28_4_;
    local_2240._0_4_ = (float)local_2240 + (float)local_2260;
    local_2240._4_4_ = local_2240._4_4_ + local_2260._4_4_;
    uStack_2238._0_4_ = (float)uStack_2238 + (float)uStack_2258;
    uStack_2238._4_4_ = uStack_2238._4_4_ + uStack_2258._4_4_;
    uStack_2230._0_4_ = (float)uStack_2230 + (float)uStack_2250;
    uStack_2230._4_4_ = uStack_2230._4_4_ + uStack_2250._4_4_;
    uStack_2228._0_4_ = (float)uStack_2228 + (float)uStack_2248;
    fStack_2384 = uStack_2228._4_4_ + uStack_2248._4_4_;
    local_22c0._4_4_ = local_2240._4_4_;
    local_22c0._0_4_ = (float)local_2240;
    uStack_22b8._0_4_ = (float)uStack_2238;
    uStack_22b8._4_4_ = uStack_2238._4_4_;
    uStack_22b0._0_4_ = (float)uStack_2230;
    uStack_22b0._4_4_ = uStack_2230._4_4_;
    auVar58 = _local_22c0;
    uStack_22a8._0_4_ = (float)uStack_2228;
    uStack_22a8._4_4_ = fStack_2384;
    auVar2 = _local_22c0;
    local_20e0 = local_22c0;
    uStack_20d8 = uStack_22b8;
    uStack_22b0 = auVar58._16_8_;
    uStack_20d0 = uStack_22b0;
    uStack_22a8 = auVar2._24_8_;
    uStack_20c8 = uStack_22a8;
    local_23a0 = (float)local_2240 * (float)local_2240;
    fStack_239c = local_2240._4_4_ * local_2240._4_4_;
    fStack_2398 = (float)uStack_2238 * (float)uStack_2238;
    fStack_2394 = uStack_2238._4_4_ * uStack_2238._4_4_;
    fStack_2390 = (float)uStack_2230 * (float)uStack_2230;
    fStack_238c = uStack_2230._4_4_ * uStack_2230._4_4_;
    fStack_2388 = (float)uStack_2228 * (float)uStack_2228;
    local_1f78 = local_23c0;
    local_2018 = local_22c0;
    local_1a78 = ::_ps256_cephes_log_p1;
    local_1a00 = 0x3d9021bb3d9021bb;
    uStack_19f8 = 0x3d9021bb3d9021bb;
    uStack_19f0 = 0x3d9021bb3d9021bb;
    uStack_19e8 = 0x3d9021bb3d9021bb;
    local_1a20 = local_22c0;
    uStack_1a18 = uStack_22b8;
    uStack_1a10 = uStack_22b0;
    uStack_1a08 = uStack_22a8;
    local_1a40 = (float)local_2240 * 0.070376836;
    fStack_1a3c = local_2240._4_4_ * 0.070376836;
    fStack_1a38 = (float)uStack_2238 * 0.070376836;
    fStack_1a34 = uStack_2238._4_4_ * 0.070376836;
    fStack_1a30 = (float)uStack_2230 * 0.070376836;
    fStack_1a2c = uStack_2230._4_4_ * 0.070376836;
    fStack_1a28 = (float)uStack_2228 * 0.070376836;
    local_1a60[0] = -0.1151461;
    local_1a60[1] = -0.1151461;
    afStack_1a58[0] = -0.1151461;
    afStack_1a58[1] = -0.1151461;
    afStack_1a50[0] = -0.1151461;
    afStack_1a50[1] = -0.1151461;
    afStack_1a48[0] = -0.1151461;
    afStack_1a48[1] = -0.1151461;
    local_23c0._4_4_ = fStack_1a3c + -0.1151461;
    local_23c0._0_4_ = local_1a40 + -0.1151461;
    uStack_23b8._0_4_ = fStack_1a38 + -0.1151461;
    uStack_23b8._4_4_ = fStack_1a34 + -0.1151461;
    uStack_23b0._0_4_ = fStack_1a30 + -0.1151461;
    uStack_23b0._4_4_ = fStack_1a2c + -0.1151461;
    auVar58 = _local_23c0;
    uStack_23a8._0_4_ = fStack_1a28 + -0.1151461;
    uStack_23a8._4_4_ = fStack_2384 + -0.1151461;
    auVar2 = _local_23c0;
    local_1b18 = ::_ps256_cephes_log_p2;
    local_1aa0 = local_23c0;
    uStack_1a98 = uStack_23b8;
    uStack_23b0 = auVar58._16_8_;
    uStack_1a90 = uStack_23b0;
    uStack_23a8 = auVar2._24_8_;
    uStack_1a88 = uStack_23a8;
    local_1ac0 = local_22c0;
    uStack_1ab8 = uStack_22b8;
    uStack_1ab0 = uStack_22b0;
    uStack_1aa8 = uStack_22a8;
    local_1ae0 = (local_1a40 + -0.1151461) * (float)local_2240;
    fStack_1adc = (fStack_1a3c + -0.1151461) * local_2240._4_4_;
    fStack_1ad8 = (fStack_1a38 + -0.1151461) * (float)uStack_2238;
    fStack_1ad4 = (fStack_1a34 + -0.1151461) * uStack_2238._4_4_;
    fStack_1ad0 = (fStack_1a30 + -0.1151461) * (float)uStack_2230;
    fStack_1acc = (fStack_1a2c + -0.1151461) * uStack_2230._4_4_;
    fStack_1ac8 = (fStack_1a28 + -0.1151461) * (float)uStack_2228;
    local_1b00[0] = 0.116769984;
    local_1b00[1] = 0.116769984;
    afStack_1af8[0] = 0.116769984;
    afStack_1af8[1] = 0.116769984;
    afStack_1af0[0] = 0.116769984;
    afStack_1af0[1] = 0.116769984;
    afStack_1ae8[0] = 0.116769984;
    afStack_1ae8[1] = 0.116769984;
    local_23c0._4_4_ = fStack_1adc + 0.116769984;
    local_23c0._0_4_ = local_1ae0 + 0.116769984;
    uStack_23b8._0_4_ = fStack_1ad8 + 0.116769984;
    uStack_23b8._4_4_ = fStack_1ad4 + 0.116769984;
    uStack_23b0._0_4_ = fStack_1ad0 + 0.116769984;
    uStack_23b0._4_4_ = fStack_1acc + 0.116769984;
    auVar58 = _local_23c0;
    uStack_23a8._0_4_ = fStack_1ac8 + 0.116769984;
    uStack_23a8._4_4_ = fStack_2384 + 0.116769984;
    auVar2 = _local_23c0;
    local_1bb8 = ::_ps256_cephes_log_p3;
    local_1b40 = local_23c0;
    uStack_1b38 = uStack_23b8;
    uStack_23b0 = auVar58._16_8_;
    uStack_1b30 = uStack_23b0;
    uStack_23a8 = auVar2._24_8_;
    uStack_1b28 = uStack_23a8;
    local_1b60 = local_22c0;
    uStack_1b58 = uStack_22b8;
    uStack_1b50 = uStack_22b0;
    uStack_1b48 = uStack_22a8;
    local_1b80 = (local_1ae0 + 0.116769984) * (float)local_2240;
    fStack_1b7c = (fStack_1adc + 0.116769984) * local_2240._4_4_;
    fStack_1b78 = (fStack_1ad8 + 0.116769984) * (float)uStack_2238;
    fStack_1b74 = (fStack_1ad4 + 0.116769984) * uStack_2238._4_4_;
    fStack_1b70 = (fStack_1ad0 + 0.116769984) * (float)uStack_2230;
    fStack_1b6c = (fStack_1acc + 0.116769984) * uStack_2230._4_4_;
    fStack_1b68 = (fStack_1ac8 + 0.116769984) * (float)uStack_2228;
    local_1ba0[0] = -0.12420141;
    local_1ba0[1] = -0.12420141;
    afStack_1b98[0] = -0.12420141;
    afStack_1b98[1] = -0.12420141;
    afStack_1b90[0] = -0.12420141;
    afStack_1b90[1] = -0.12420141;
    afStack_1b88[0] = -0.12420141;
    afStack_1b88[1] = -0.12420141;
    local_23c0._4_4_ = fStack_1b7c + -0.12420141;
    local_23c0._0_4_ = local_1b80 + -0.12420141;
    uStack_23b8._0_4_ = fStack_1b78 + -0.12420141;
    uStack_23b8._4_4_ = fStack_1b74 + -0.12420141;
    uStack_23b0._0_4_ = fStack_1b70 + -0.12420141;
    uStack_23b0._4_4_ = fStack_1b6c + -0.12420141;
    auVar58 = _local_23c0;
    uStack_23a8._0_4_ = fStack_1b68 + -0.12420141;
    uStack_23a8._4_4_ = fStack_2384 + -0.12420141;
    auVar2 = _local_23c0;
    local_1c58 = ::_ps256_cephes_log_p4;
    local_1be0 = local_23c0;
    uStack_1bd8 = uStack_23b8;
    uStack_23b0 = auVar58._16_8_;
    uStack_1bd0 = uStack_23b0;
    uStack_23a8 = auVar2._24_8_;
    uStack_1bc8 = uStack_23a8;
    local_1c00 = local_22c0;
    uStack_1bf8 = uStack_22b8;
    uStack_1bf0 = uStack_22b0;
    uStack_1be8 = uStack_22a8;
    local_1c20 = (local_1b80 + -0.12420141) * (float)local_2240;
    fStack_1c1c = (fStack_1b7c + -0.12420141) * local_2240._4_4_;
    fStack_1c18 = (fStack_1b78 + -0.12420141) * (float)uStack_2238;
    fStack_1c14 = (fStack_1b74 + -0.12420141) * uStack_2238._4_4_;
    fStack_1c10 = (fStack_1b70 + -0.12420141) * (float)uStack_2230;
    fStack_1c0c = (fStack_1b6c + -0.12420141) * uStack_2230._4_4_;
    fStack_1c08 = (fStack_1b68 + -0.12420141) * (float)uStack_2228;
    local_1c40[0] = 0.14249323;
    local_1c40[1] = 0.14249323;
    afStack_1c38[0] = 0.14249323;
    afStack_1c38[1] = 0.14249323;
    afStack_1c30[0] = 0.14249323;
    afStack_1c30[1] = 0.14249323;
    afStack_1c28[0] = 0.14249323;
    afStack_1c28[1] = 0.14249323;
    local_23c0._4_4_ = fStack_1c1c + 0.14249323;
    local_23c0._0_4_ = local_1c20 + 0.14249323;
    uStack_23b8._0_4_ = fStack_1c18 + 0.14249323;
    uStack_23b8._4_4_ = fStack_1c14 + 0.14249323;
    uStack_23b0._0_4_ = fStack_1c10 + 0.14249323;
    uStack_23b0._4_4_ = fStack_1c0c + 0.14249323;
    auVar58 = _local_23c0;
    uStack_23a8._0_4_ = fStack_1c08 + 0.14249323;
    uStack_23a8._4_4_ = fStack_2384 + 0.14249323;
    auVar2 = _local_23c0;
    local_1cf8 = ::_ps256_cephes_log_p5;
    local_1c80 = local_23c0;
    uStack_1c78 = uStack_23b8;
    uStack_23b0 = auVar58._16_8_;
    uStack_1c70 = uStack_23b0;
    uStack_23a8 = auVar2._24_8_;
    uStack_1c68 = uStack_23a8;
    local_1ca0 = local_22c0;
    uStack_1c98 = uStack_22b8;
    uStack_1c90 = uStack_22b0;
    uStack_1c88 = uStack_22a8;
    local_1cc0 = (local_1c20 + 0.14249323) * (float)local_2240;
    fStack_1cbc = (fStack_1c1c + 0.14249323) * local_2240._4_4_;
    fStack_1cb8 = (fStack_1c18 + 0.14249323) * (float)uStack_2238;
    fStack_1cb4 = (fStack_1c14 + 0.14249323) * uStack_2238._4_4_;
    fStack_1cb0 = (fStack_1c10 + 0.14249323) * (float)uStack_2230;
    fStack_1cac = (fStack_1c0c + 0.14249323) * uStack_2230._4_4_;
    fStack_1ca8 = (fStack_1c08 + 0.14249323) * (float)uStack_2228;
    local_1ce0[0] = -0.16668057;
    local_1ce0[1] = -0.16668057;
    afStack_1cd8[0] = -0.16668057;
    afStack_1cd8[1] = -0.16668057;
    afStack_1cd0[0] = -0.16668057;
    afStack_1cd0[1] = -0.16668057;
    afStack_1cc8[0] = -0.16668057;
    afStack_1cc8[1] = -0.16668057;
    local_23c0._4_4_ = fStack_1cbc + -0.16668057;
    local_23c0._0_4_ = local_1cc0 + -0.16668057;
    uStack_23b8._0_4_ = fStack_1cb8 + -0.16668057;
    uStack_23b8._4_4_ = fStack_1cb4 + -0.16668057;
    uStack_23b0._0_4_ = fStack_1cb0 + -0.16668057;
    uStack_23b0._4_4_ = fStack_1cac + -0.16668057;
    auVar58 = _local_23c0;
    uStack_23a8._0_4_ = fStack_1ca8 + -0.16668057;
    uStack_23a8._4_4_ = fStack_2384 + -0.16668057;
    auVar2 = _local_23c0;
    local_1d98 = ::_ps256_cephes_log_p6;
    local_1d20 = local_23c0;
    uStack_1d18 = uStack_23b8;
    uStack_23b0 = auVar58._16_8_;
    uStack_1d10 = uStack_23b0;
    uStack_23a8 = auVar2._24_8_;
    uStack_1d08 = uStack_23a8;
    local_1d40 = local_22c0;
    uStack_1d38 = uStack_22b8;
    uStack_1d30 = uStack_22b0;
    uStack_1d28 = uStack_22a8;
    local_1d60 = (local_1cc0 + -0.16668057) * (float)local_2240;
    fStack_1d5c = (fStack_1cbc + -0.16668057) * local_2240._4_4_;
    fStack_1d58 = (fStack_1cb8 + -0.16668057) * (float)uStack_2238;
    fStack_1d54 = (fStack_1cb4 + -0.16668057) * uStack_2238._4_4_;
    fStack_1d50 = (fStack_1cb0 + -0.16668057) * (float)uStack_2230;
    fStack_1d4c = (fStack_1cac + -0.16668057) * uStack_2230._4_4_;
    fStack_1d48 = (fStack_1ca8 + -0.16668057) * (float)uStack_2228;
    local_1d80[0] = 0.20000714;
    local_1d80[1] = 0.20000714;
    afStack_1d78[0] = 0.20000714;
    afStack_1d78[1] = 0.20000714;
    afStack_1d70[0] = 0.20000714;
    afStack_1d70[1] = 0.20000714;
    afStack_1d68[0] = 0.20000714;
    afStack_1d68[1] = 0.20000714;
    local_23c0._4_4_ = fStack_1d5c + 0.20000714;
    local_23c0._0_4_ = local_1d60 + 0.20000714;
    uStack_23b8._0_4_ = fStack_1d58 + 0.20000714;
    uStack_23b8._4_4_ = fStack_1d54 + 0.20000714;
    uStack_23b0._0_4_ = fStack_1d50 + 0.20000714;
    uStack_23b0._4_4_ = fStack_1d4c + 0.20000714;
    auVar58 = _local_23c0;
    uStack_23a8._0_4_ = fStack_1d48 + 0.20000714;
    uStack_23a8._4_4_ = fStack_2384 + 0.20000714;
    auVar2 = _local_23c0;
    local_1e38 = ::_ps256_cephes_log_p7;
    local_1dc0 = local_23c0;
    uStack_1db8 = uStack_23b8;
    uStack_23b0 = auVar58._16_8_;
    uStack_1db0 = uStack_23b0;
    uStack_23a8 = auVar2._24_8_;
    uStack_1da8 = uStack_23a8;
    local_1de0 = local_22c0;
    uStack_1dd8 = uStack_22b8;
    uStack_1dd0 = uStack_22b0;
    uStack_1dc8 = uStack_22a8;
    local_1e00 = (local_1d60 + 0.20000714) * (float)local_2240;
    fStack_1dfc = (fStack_1d5c + 0.20000714) * local_2240._4_4_;
    fStack_1df8 = (fStack_1d58 + 0.20000714) * (float)uStack_2238;
    fStack_1df4 = (fStack_1d54 + 0.20000714) * uStack_2238._4_4_;
    fStack_1df0 = (fStack_1d50 + 0.20000714) * (float)uStack_2230;
    fStack_1dec = (fStack_1d4c + 0.20000714) * uStack_2230._4_4_;
    fStack_1de8 = (fStack_1d48 + 0.20000714) * (float)uStack_2228;
    local_1e20[0] = -0.24999994;
    local_1e20[1] = -0.24999994;
    afStack_1e18[0] = -0.24999994;
    afStack_1e18[1] = -0.24999994;
    afStack_1e10[0] = -0.24999994;
    afStack_1e10[1] = -0.24999994;
    afStack_1e08[0] = -0.24999994;
    afStack_1e08[1] = -0.24999994;
    local_23c0._4_4_ = fStack_1dfc + -0.24999994;
    local_23c0._0_4_ = local_1e00 + -0.24999994;
    uStack_23b8._0_4_ = fStack_1df8 + -0.24999994;
    uStack_23b8._4_4_ = fStack_1df4 + -0.24999994;
    uStack_23b0._0_4_ = fStack_1df0 + -0.24999994;
    uStack_23b0._4_4_ = fStack_1dec + -0.24999994;
    auVar58 = _local_23c0;
    uStack_23a8._0_4_ = fStack_1de8 + -0.24999994;
    uStack_23a8._4_4_ = fStack_2384 + -0.24999994;
    auVar2 = _local_23c0;
    local_1ed8 = ::_ps256_cephes_log_p8;
    local_1e60 = local_23c0;
    uStack_1e58 = uStack_23b8;
    uStack_23b0 = auVar58._16_8_;
    uStack_1e50 = uStack_23b0;
    uStack_23a8 = auVar2._24_8_;
    uStack_1e48 = uStack_23a8;
    local_1e80 = local_22c0;
    uStack_1e78 = uStack_22b8;
    uStack_1e70 = uStack_22b0;
    uStack_1e68 = uStack_22a8;
    local_1ea0 = (local_1e00 + -0.24999994) * (float)local_2240;
    fStack_1e9c = (fStack_1dfc + -0.24999994) * local_2240._4_4_;
    fStack_1e98 = (fStack_1df8 + -0.24999994) * (float)uStack_2238;
    fStack_1e94 = (fStack_1df4 + -0.24999994) * uStack_2238._4_4_;
    fStack_1e90 = (fStack_1df0 + -0.24999994) * (float)uStack_2230;
    fStack_1e8c = (fStack_1dec + -0.24999994) * uStack_2230._4_4_;
    fStack_1e88 = (fStack_1de8 + -0.24999994) * (float)uStack_2228;
    local_1ec0[0] = 0.3333333;
    local_1ec0[1] = 0.3333333;
    afStack_1eb8[0] = 0.3333333;
    afStack_1eb8[1] = 0.3333333;
    afStack_1eb0[0] = 0.3333333;
    afStack_1eb0[1] = 0.3333333;
    afStack_1ea8[0] = 0.3333333;
    afStack_1ea8[1] = 0.3333333;
    fVar66 = fStack_2384 + 0.3333333;
    local_23c0._4_4_ = fStack_1e9c + 0.3333333;
    local_23c0._0_4_ = local_1ea0 + 0.3333333;
    uStack_23b8._0_4_ = fStack_1e98 + 0.3333333;
    uStack_23b8._4_4_ = fStack_1e94 + 0.3333333;
    uStack_23b0._0_4_ = fStack_1e90 + 0.3333333;
    uStack_23b0._4_4_ = fStack_1e8c + 0.3333333;
    auVar58 = _local_23c0;
    uStack_23a8._0_4_ = fStack_1e88 + 0.3333333;
    uStack_23a8._4_4_ = fVar66;
    auVar2 = _local_23c0;
    local_2100 = local_23c0;
    uStack_20f8 = uStack_23b8;
    uStack_23b0 = auVar58._16_8_;
    uStack_20f0 = uStack_23b0;
    uStack_23a8 = auVar2._24_8_;
    uStack_20e8 = uStack_23a8;
    local_2120 = local_22c0;
    uStack_2118 = uStack_22b8;
    uStack_2110 = uStack_22b0;
    uStack_2108 = uStack_22a8;
    local_23c0._0_4_ = (local_1ea0 + 0.3333333) * (float)local_2240;
    local_23c0._4_4_ = (fStack_1e9c + 0.3333333) * local_2240._4_4_;
    fVar61 = (fStack_1e98 + 0.3333333) * (float)uStack_2238;
    fVar62 = (fStack_1e94 + 0.3333333) * uStack_2238._4_4_;
    fVar63 = (fStack_1e90 + 0.3333333) * (float)uStack_2230;
    fVar64 = (fStack_1e8c + 0.3333333) * uStack_2230._4_4_;
    fVar65 = (fStack_1e88 + 0.3333333) * (float)uStack_2228;
    uStack_23b8._0_4_ = fVar61;
    uStack_23b8._4_4_ = fVar62;
    uStack_23b0._0_4_ = fVar63;
    uStack_23b0._4_4_ = fVar64;
    auVar58 = _local_23c0;
    uStack_23a8._0_4_ = fVar65;
    auVar2 = _local_23c0;
    local_2140 = local_23c0;
    uStack_2138 = uStack_23b8;
    uStack_23b0 = auVar58._16_8_;
    uStack_2130 = uStack_23b0;
    uStack_23a8 = auVar2._24_8_;
    uStack_2128 = uStack_23a8;
    local_2160 = CONCAT44(fStack_239c,local_23a0);
    uStack_2158 = CONCAT44(fStack_2394,fStack_2398);
    uStack_2150 = CONCAT44(fStack_238c,fStack_2390);
    uStack_2148 = CONCAT44(fStack_2384,fStack_2388);
    local_23c0._0_4_ = (float)local_23c0._0_4_ * local_23a0;
    local_23c0._4_4_ = (float)local_23c0._4_4_ * fStack_239c;
    fVar61 = fVar61 * fStack_2398;
    fVar62 = fVar62 * fStack_2394;
    fVar63 = fVar63 * fStack_2390;
    fVar64 = fVar64 * fStack_238c;
    fVar65 = fVar65 * fStack_2388;
    uStack_23b8._0_4_ = fVar61;
    uStack_23b8._4_4_ = fVar62;
    uStack_23b0._0_4_ = fVar63;
    uStack_23b0._4_4_ = fVar64;
    auVar58 = _local_23c0;
    uStack_23a8._0_4_ = fVar65;
    auVar2 = _local_23c0;
    local_2008 = local_2340;
    local_1f70 = ::_ps256_cephes_log_q1;
    local_1f20[0] = -0.00021219444;
    local_1f20[1] = -0.00021219444;
    afStack_1f18[0] = -0.00021219444;
    afStack_1f18[1] = -0.00021219444;
    afStack_1f10[0] = -0.00021219444;
    afStack_1f10[1] = -0.00021219444;
    afStack_1f08[0] = -0.00021219444;
    afStack_1f08[1] = -0.00021219444;
    local_1f00._0_4_ = local_2340._0_4_;
    local_1f00._4_4_ = local_2340._4_4_;
    uStack_1ef8._0_4_ = local_2340._8_4_;
    uStack_1ef8._4_4_ = local_2340._12_4_;
    uStack_1ef0._0_4_ = local_2340._16_4_;
    uStack_1ef0._4_4_ = local_2340._20_4_;
    uStack_1ee8._0_4_ = local_2340._24_4_;
    uStack_1f24 = 0xb95e8083;
    local_1f40 = (float)local_1f00 * -0.00021219444;
    fStack_1f3c = local_1f00._4_4_ * -0.00021219444;
    fStack_1f38 = (float)uStack_1ef8 * -0.00021219444;
    fStack_1f34 = uStack_1ef8._4_4_ * -0.00021219444;
    fStack_1f30 = (float)uStack_1ef0 * -0.00021219444;
    fStack_1f2c = uStack_1ef0._4_4_ * -0.00021219444;
    fStack_1f28 = (float)uStack_1ee8 * -0.00021219444;
    local_1f60 = local_23c0;
    uStack_1f58 = uStack_23b8;
    uStack_23b0 = auVar58._16_8_;
    uStack_1f50 = uStack_23b0;
    uStack_23a8 = auVar2._24_8_;
    uStack_1f48 = uStack_23a8;
    local_23c0._4_4_ = fStack_1f3c + (float)local_23c0._4_4_;
    local_23c0._0_4_ = local_1f40 + (float)local_23c0._0_4_;
    uStack_23b8._0_4_ = fStack_1f38 + fVar61;
    uStack_23b8._4_4_ = fStack_1f34 + fVar62;
    uStack_23b0._0_4_ = fStack_1f30 + fVar63;
    uStack_23b0._4_4_ = fStack_1f2c + fVar64;
    auVar58 = _local_23c0;
    uStack_23a8._0_4_ = fStack_1f28 + fVar65;
    uStack_23a8._4_4_ = fVar66 + -0.00021219444;
    auVar2 = _local_23c0;
    local_1468 = &local_23a0;
    local_1470 = ::_ps256_0p5;
    local_1440 = local_23c0;
    uStack_1438 = uStack_23b8;
    uStack_23b0 = auVar58._16_8_;
    uStack_1430 = uStack_23b0;
    uStack_23a8 = auVar2._24_8_;
    uStack_1428 = uStack_23a8;
    local_1400 = CONCAT44(fStack_239c,local_23a0);
    uStack_13f8 = CONCAT44(fStack_2394,fStack_2398);
    uStack_13f0 = CONCAT44(fStack_238c,fStack_2390);
    uStack_13e8 = CONCAT44(fStack_2384,fStack_2388);
    local_1420[0] = 0.5;
    local_1420[1] = 0.5;
    afStack_1418[0] = 0.5;
    afStack_1418[1] = 0.5;
    afStack_1410[0] = 0.5;
    afStack_1410[1] = 0.5;
    afStack_1408[0] = 0.5;
    afStack_1408[1] = 0.5;
    local_1460 = local_23a0 * 0.5;
    fStack_145c = fStack_239c * 0.5;
    fStack_1458 = fStack_2398 * 0.5;
    fStack_1454 = fStack_2394 * 0.5;
    fStack_1450 = fStack_2390 * 0.5;
    fStack_144c = fStack_238c * 0.5;
    fStack_1448 = fStack_2388 * 0.5;
    auVar29._4_4_ = fStack_145c;
    auVar29._0_4_ = local_1460;
    auVar29._8_4_ = fStack_1458;
    auVar29._12_4_ = fStack_1454;
    auVar29._16_4_ = fStack_1450;
    auVar29._20_4_ = fStack_144c;
    auVar29._24_4_ = fStack_1448;
    auVar29._28_4_ = fStack_2384;
    auVar2 = vsubps_avx(auVar2,auVar29);
    local_2280 = local_22c0;
    uStack_2278 = uStack_22b8;
    uStack_2270 = uStack_22b0;
    uStack_2268 = uStack_22a8;
    local_23c0 = auVar2._0_8_;
    uVar15 = local_23c0;
    uStack_23b8 = auVar2._8_8_;
    uVar16 = uStack_23b8;
    uStack_23b0 = auVar2._16_8_;
    uVar17 = uStack_23b0;
    uStack_23a8 = auVar2._24_8_;
    uVar18 = uStack_23a8;
    local_22a0._0_4_ = auVar2._0_4_;
    local_22a0._4_4_ = auVar2._4_4_;
    uStack_2298._0_4_ = auVar2._8_4_;
    uStack_2298._4_4_ = auVar2._12_4_;
    uStack_2290._0_4_ = auVar2._16_4_;
    uStack_2290._4_4_ = auVar2._20_4_;
    uStack_2288._0_4_ = auVar2._24_4_;
    uStack_2288._4_4_ = auVar2._28_4_;
    local_22c0._4_4_ = local_2240._4_4_ + local_22a0._4_4_;
    local_22c0._0_4_ = (float)local_2240 + (float)local_22a0;
    uStack_22b8._0_4_ = (float)uStack_2238 + (float)uStack_2298;
    uStack_22b8._4_4_ = uStack_2238._4_4_ + uStack_2298._4_4_;
    uStack_22b0._0_4_ = (float)uStack_2230 + (float)uStack_2290;
    uStack_22b0._4_4_ = uStack_2230._4_4_ + uStack_2290._4_4_;
    auVar58 = _local_22c0;
    uStack_22a8._0_4_ = (float)uStack_2228 + (float)uStack_2288;
    uStack_22a8._4_4_ = fStack_2384 + uStack_2288._4_4_;
    auVar2 = _local_22c0;
    local_2010 = ::_ps256_cephes_log_q2;
    local_1fa0 = local_2340;
    uStack_1f98 = uStack_2338;
    uStack_1f90 = uStack_2330;
    uStack_1f88 = uStack_2328;
    local_1fc0[0] = 0.6933594;
    local_1fc0[1] = 0.6933594;
    afStack_1fb8[0] = 0.6933594;
    afStack_1fb8[1] = 0.6933594;
    afStack_1fb0[0] = 0.6933594;
    afStack_1fb0[1] = 0.6933594;
    afStack_1fa8[0] = 0.6933594;
    afStack_1fa8[1] = 0.6933594;
    uStack_1fc4 = 0x3f318000;
    local_1fe0 = (float)local_1f00 * 0.6933594;
    fStack_1fdc = local_1f00._4_4_ * 0.6933594;
    fStack_1fd8 = (float)uStack_1ef8 * 0.6933594;
    fStack_1fd4 = uStack_1ef8._4_4_ * 0.6933594;
    fStack_1fd0 = (float)uStack_1ef0 * 0.6933594;
    fStack_1fcc = uStack_1ef0._4_4_ * 0.6933594;
    fStack_1fc8 = (float)uStack_1ee8 * 0.6933594;
    local_2000 = local_22c0;
    uStack_1ff8 = uStack_22b8;
    uStack_22b0 = auVar58._16_8_;
    uStack_1ff0 = uStack_22b0;
    uStack_22a8 = auVar2._24_8_;
    uStack_1fe8 = uStack_22a8;
    local_22c0._4_4_ = fStack_1fdc + local_2240._4_4_ + local_22a0._4_4_;
    local_22c0._0_4_ = local_1fe0 + (float)local_2240 + (float)local_22a0;
    uStack_22b8._0_4_ = fStack_1fd8 + (float)uStack_2238 + (float)uStack_2298;
    uStack_22b8._4_4_ = fStack_1fd4 + uStack_2238._4_4_ + uStack_2298._4_4_;
    uStack_22b0._0_4_ = fStack_1fd0 + (float)uStack_2230 + (float)uStack_2290;
    uStack_22b0._4_4_ = fStack_1fcc + uStack_2230._4_4_ + uStack_2290._4_4_;
    auVar58 = _local_22c0;
    uStack_22a8._0_4_ = fStack_1fc8 + (float)uStack_2228 + (float)uStack_2288;
    uStack_22a8._4_4_ = fStack_2384 + uStack_2288._4_4_ + 0.6933594;
    auVar23 = _local_22c0;
    local_f20 = local_22c0;
    uStack_f18 = uStack_22b8;
    uStack_22b0 = auVar58._16_8_;
    uStack_f10 = uStack_22b0;
    uStack_22a8 = auVar23._24_8_;
    uStack_f08 = uStack_22a8;
    local_f40 = local_2320._0_8_;
    uStack_f38 = local_2320._8_8_;
    uStack_f30 = local_2320._16_8_;
    uStack_f28 = local_2320._24_8_;
    auVar33._16_8_ = uStack_22b0;
    auVar33._0_16_ = _local_22c0;
    auVar33._24_8_ = uStack_22a8;
    _local_23c0 = vorps_avx(auVar33,local_2320);
    local_2660._0_4_ = (float)local_28a0;
    local_2660._4_4_ = (float)((ulong)local_28a0 >> 0x20);
    uStack_2658._0_4_ = (float)uStack_2898;
    uStack_2658._4_4_ = (float)((ulong)uStack_2898 >> 0x20);
    uStack_2650._0_4_ = (float)uStack_2890;
    uStack_2650._4_4_ = (float)((ulong)uStack_2890 >> 0x20);
    uStack_2648._0_4_ = (float)uStack_2888;
    uStack_2648._4_4_ = (undefined4)((ulong)uStack_2888 >> 0x20);
    local_2680._0_4_ = local_23c0._0_4_;
    local_2680._4_4_ = local_23c0._4_4_;
    uStack_2678._0_4_ = local_23c0._8_4_;
    uStack_2678._4_4_ = local_23c0._12_4_;
    uStack_2670._0_4_ = local_23c0._16_4_;
    uStack_2670._4_4_ = local_23c0._20_4_;
    uStack_2668._0_4_ = local_23c0._24_4_;
    local_2560._4_4_ = local_2660._4_4_ * local_2680._4_4_;
    local_2560._0_4_ = (float)local_2660 * (float)local_2680;
    uStack_2558._0_4_ = (float)uStack_2658 * (float)uStack_2678;
    uStack_2558._4_4_ = uStack_2658._4_4_ * uStack_2678._4_4_;
    uStack_2550._0_4_ = (float)uStack_2650 * (float)uStack_2670;
    uStack_2550._4_4_ = uStack_2650._4_4_ * uStack_2670._4_4_;
    auVar58 = _local_2560;
    uStack_2548._0_4_ = (float)uStack_2648 * (float)uStack_2668;
    uStack_2548._4_4_ = uStack_2648._4_4_;
    auVar2 = _local_2560;
    local_2040 = 0;
    uStack_2038 = 0;
    uStack_2030 = 0;
    uStack_2028 = 0;
    local_23e0 = local_2560;
    uStack_23d8 = uStack_2558;
    uStack_2550 = auVar58._16_8_;
    uStack_23d0 = uStack_2550;
    uStack_2548 = auVar2._24_8_;
    uStack_23c8 = uStack_2548;
    local_2400 = 0x42b0c0a542b0c0a5;
    uStack_23f8 = 0x42b0c0a542b0c0a5;
    uStack_23f0 = 0x42b0c0a542b0c0a5;
    uStack_23e8 = 0x42b0c0a542b0c0a5;
    auVar6._16_8_ = uStack_2550;
    auVar6._0_16_ = _local_2560;
    auVar6._24_8_ = uStack_2548;
    auVar2._8_8_ = 0x42b0c0a542b0c0a5;
    auVar2._0_8_ = 0x42b0c0a542b0c0a5;
    auVar2._16_8_ = 0x42b0c0a542b0c0a5;
    auVar2._24_8_ = 0x42b0c0a542b0c0a5;
    auVar2 = vminps_avx(auVar6,auVar2);
    local_2560 = auVar2._0_8_;
    local_2420 = local_2560;
    uStack_2558 = auVar2._8_8_;
    uStack_2418 = uStack_2558;
    uStack_2550 = auVar2._16_8_;
    uStack_2410 = uStack_2550;
    uStack_2548 = auVar2._24_8_;
    uStack_2408 = uStack_2548;
    local_2440 = 0xc2b0c0a5c2b0c0a5;
    uStack_2438 = 0xc2b0c0a5c2b0c0a5;
    uStack_2430 = 0xc2b0c0a5c2b0c0a5;
    uStack_2428 = 0xc2b0c0a5c2b0c0a5;
    auVar3._8_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar3._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar3._16_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar3._24_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar3 = vmaxps_avx(auVar2,auVar3);
    local_19d8 = local_2560;
    local_1610 = ::_ps256_cephes_LOG2EF;
    local_1618 = ::_ps256_0p5;
    local_2560 = auVar3._0_8_;
    uVar19 = local_2560;
    uStack_2558 = auVar3._8_8_;
    uVar20 = uStack_2558;
    uStack_2550 = auVar3._16_8_;
    uVar21 = uStack_2550;
    uStack_2548 = auVar3._24_8_;
    uVar22 = uStack_2548;
    local_15c0[0] = 1.442695;
    local_15c0[1] = 1.442695;
    afStack_15b8[0] = 1.442695;
    afStack_15b8[1] = 1.442695;
    afStack_15b0[0] = 1.442695;
    afStack_15b0[1] = 1.442695;
    afStack_15a8[0] = 1.442695;
    afStack_15a8[1] = 1.442695;
    local_15a0._0_4_ = auVar3._0_4_;
    local_15a0._4_4_ = auVar3._4_4_;
    uStack_1598._0_4_ = auVar3._8_4_;
    uStack_1598._4_4_ = auVar3._12_4_;
    uStack_1590._0_4_ = auVar3._16_4_;
    uStack_1590._4_4_ = auVar3._20_4_;
    uStack_1588._0_4_ = auVar3._24_4_;
    uStack_15c4 = 0x3fb8aa3b;
    local_15e0 = (float)local_15a0 * 1.442695;
    fStack_15dc = local_15a0._4_4_ * 1.442695;
    fStack_15d8 = (float)uStack_1598 * 1.442695;
    fStack_15d4 = uStack_1598._4_4_ * 1.442695;
    fStack_15d0 = (float)uStack_1590 * 1.442695;
    fStack_15cc = uStack_1590._4_4_ * 1.442695;
    fStack_15c8 = (float)uStack_1588 * 1.442695;
    local_1600[0] = 0.5;
    local_1600[1] = 0.5;
    afStack_15f8[0] = 0.5;
    afStack_15f8[1] = 0.5;
    afStack_15f0[0] = 0.5;
    afStack_15f0[1] = 0.5;
    afStack_15e8[0] = 0.5;
    afStack_15e8[1] = 0.5;
    local_25a0._4_4_ = fStack_15dc + 0.5;
    local_25a0._0_4_ = local_15e0 + 0.5;
    uStack_2598._0_4_ = fStack_15d8 + 0.5;
    uStack_2598._4_4_ = fStack_15d4 + 0.5;
    uStack_2590._0_4_ = fStack_15d0 + 0.5;
    uStack_2590._4_4_ = fStack_15cc + 0.5;
    uStack_2588._0_4_ = fStack_15c8 + 0.5;
    uStack_2588._4_4_ = 0x3ff8aa3b;
    auVar6 = vroundps_avx(_local_25a0,1);
    auVar2 = vcmpps_avx(_local_25a0,auVar6,1);
    local_2600._0_8_ = auVar2._0_8_;
    local_14a0 = local_2600._0_8_;
    local_2600._8_8_ = auVar2._8_8_;
    uStack_1498 = local_2600._8_8_;
    local_2600._16_8_ = auVar2._16_8_;
    uStack_1490 = local_2600._16_8_;
    local_2600._24_8_ = auVar2._24_8_;
    uStack_1488 = local_2600._24_8_;
    local_14c0 = 0x3f8000003f800000;
    uStack_14b8 = 0x3f8000003f800000;
    uStack_14b0 = 0x3f8000003f800000;
    uStack_14a8 = 0x3f8000003f800000;
    auVar28._8_8_ = 0x3f8000003f800000;
    auVar28._0_8_ = 0x3f8000003f800000;
    auVar28._16_8_ = 0x3f8000003f800000;
    auVar28._24_8_ = 0x3f8000003f800000;
    local_2600 = vandps_avx(auVar2,auVar28);
    local_2580 = auVar6._0_8_;
    local_24e0 = local_2580;
    uStack_2578 = auVar6._8_8_;
    uStack_24d8 = uStack_2578;
    uStack_2570 = auVar6._16_8_;
    uStack_24d0 = uStack_2570;
    uStack_2568 = auVar6._24_8_;
    uStack_24c8 = uStack_2568;
    local_2500 = local_2600._0_8_;
    uStack_24f8 = local_2600._8_8_;
    uStack_24f0 = local_2600._16_8_;
    uStack_24e8 = local_2600._24_8_;
    _local_25a0 = vsubps_avx(auVar6,local_2600);
    local_13c8 = local_25a0;
    local_1330 = ::_ps256_cephes_exp_C1;
    local_1300 = local_2560;
    uStack_12f8 = uStack_2558;
    uStack_12f0 = uStack_2550;
    uStack_12e8 = uStack_2548;
    local_12e0[0] = 0.6933594;
    local_12e0[1] = 0.6933594;
    afStack_12d8[0] = 0.6933594;
    afStack_12d8[1] = 0.6933594;
    afStack_12d0[0] = 0.6933594;
    afStack_12d0[1] = 0.6933594;
    afStack_12c8[0] = 0.6933594;
    afStack_12c8[1] = 0.6933594;
    local_12c0._0_4_ = local_25a0._0_4_;
    local_12c0._4_4_ = local_25a0._4_4_;
    uStack_12b8._0_4_ = local_25a0._8_4_;
    uStack_12b8._4_4_ = local_25a0._12_4_;
    uStack_12b0._0_4_ = local_25a0._16_4_;
    uStack_12b0._4_4_ = local_25a0._20_4_;
    uStack_12a8._0_4_ = local_25a0._24_4_;
    uStack_12a8._4_4_ = local_25a0._28_4_;
    fStack_1304 = uStack_12a8._4_4_;
    local_1320 = (float)local_12c0 * 0.6933594;
    fStack_131c = local_12c0._4_4_ * 0.6933594;
    fStack_1318 = (float)uStack_12b8 * 0.6933594;
    fStack_1314 = uStack_12b8._4_4_ * 0.6933594;
    fStack_1310 = (float)uStack_12b0 * 0.6933594;
    fStack_130c = uStack_12b0._4_4_ * 0.6933594;
    fStack_1308 = (float)uStack_12a8 * 0.6933594;
    auVar31._4_4_ = fStack_131c;
    auVar31._0_4_ = local_1320;
    auVar31._8_4_ = fStack_1318;
    auVar31._12_4_ = fStack_1314;
    auVar31._16_4_ = fStack_1310;
    auVar31._20_4_ = fStack_130c;
    auVar31._24_4_ = fStack_1308;
    auVar31._28_4_ = uStack_12a8._4_4_;
    auVar2 = vsubps_avx(auVar3,auVar31);
    local_13d0 = ::_ps256_cephes_exp_C2;
    local_2560 = auVar2._0_8_;
    local_13a0 = local_2560;
    uStack_2558 = auVar2._8_8_;
    uStack_1398 = uStack_2558;
    uStack_2550 = auVar2._16_8_;
    uStack_1390 = uStack_2550;
    uStack_2548 = auVar2._24_8_;
    uStack_1388 = uStack_2548;
    local_1360 = local_25a0;
    uStack_1358 = uStack_2598;
    uStack_1350 = uStack_2590;
    uStack_1348 = uStack_2588;
    local_1380[0] = -0.00021219444;
    local_1380[1] = -0.00021219444;
    afStack_1378[0] = -0.00021219444;
    afStack_1378[1] = -0.00021219444;
    afStack_1370[0] = -0.00021219444;
    afStack_1370[1] = -0.00021219444;
    afStack_1368[0] = -0.00021219444;
    afStack_1368[1] = -0.00021219444;
    fStack_13a4 = uStack_12a8._4_4_;
    local_13c0 = (float)local_12c0 * -0.00021219444;
    fStack_13bc = local_12c0._4_4_ * -0.00021219444;
    fStack_13b8 = (float)uStack_12b8 * -0.00021219444;
    fStack_13b4 = uStack_12b8._4_4_ * -0.00021219444;
    fStack_13b0 = (float)uStack_12b0 * -0.00021219444;
    fStack_13ac = uStack_12b0._4_4_ * -0.00021219444;
    fStack_13a8 = (float)uStack_12a8 * -0.00021219444;
    auVar30._4_4_ = fStack_13bc;
    auVar30._0_4_ = local_13c0;
    auVar30._8_4_ = fStack_13b8;
    auVar30._12_4_ = fStack_13b4;
    auVar30._16_4_ = fStack_13b0;
    auVar30._20_4_ = fStack_13ac;
    auVar30._24_4_ = fStack_13a8;
    auVar30._28_4_ = uStack_12a8._4_4_;
    _local_2560 = vsubps_avx(auVar2,auVar30);
    local_2480 = local_2560;
    uStack_2478 = uStack_2558;
    uStack_2470 = uStack_2550;
    uStack_2468 = uStack_2548;
    local_2460._0_4_ = local_2560._0_4_;
    local_2460._4_4_ = local_2560._4_4_;
    uStack_2458._0_4_ = local_2560._8_4_;
    uStack_2458._4_4_ = local_2560._12_4_;
    uStack_2450._0_4_ = local_2560._16_4_;
    uStack_2450._4_4_ = local_2560._20_4_;
    uStack_2448._0_4_ = local_2560._24_4_;
    uStack_2448._4_4_ = local_2560._28_4_;
    local_2580 = CONCAT44(local_2460._4_4_ * local_2460._4_4_,(float)local_2460 * (float)local_2460)
    ;
    uStack_2578._0_4_ = (float)uStack_2458 * (float)uStack_2458;
    uStack_2578._4_4_ = uStack_2458._4_4_ * uStack_2458._4_4_;
    uStack_2570._0_4_ = (float)uStack_2450 * (float)uStack_2450;
    uStack_2570._4_4_ = uStack_2450._4_4_ * uStack_2450._4_4_;
    auVar58 = _local_2580;
    uStack_2568._0_4_ = (float)uStack_2448 * (float)uStack_2448;
    uStack_2568._4_4_ = uStack_2448._4_4_;
    auVar2 = _local_2580;
    local_19c8 = &local_2620;
    local_16b8 = ::_ps256_cephes_exp_p1;
    local_1640 = 0x3950696739506967;
    uStack_1638 = 0x3950696739506967;
    uStack_1630 = 0x3950696739506967;
    uStack_1628 = 0x3950696739506967;
    local_1660 = local_2560;
    uStack_1658 = uStack_2558;
    uStack_1650 = uStack_2550;
    uStack_1648 = uStack_2548;
    fStack_1664 = uStack_2448._4_4_;
    local_1680 = (float)local_2460 * 0.00019875691;
    fStack_167c = local_2460._4_4_ * 0.00019875691;
    fStack_1678 = (float)uStack_2458 * 0.00019875691;
    fStack_1674 = uStack_2458._4_4_ * 0.00019875691;
    fStack_1670 = (float)uStack_2450 * 0.00019875691;
    fStack_166c = uStack_2450._4_4_ * 0.00019875691;
    fStack_1668 = (float)uStack_2448 * 0.00019875691;
    local_16a0[0] = 0.0013981999;
    local_16a0[1] = 0.0013981999;
    afStack_1698[0] = 0.0013981999;
    afStack_1698[1] = 0.0013981999;
    afStack_1690[0] = 0.0013981999;
    afStack_1690[1] = 0.0013981999;
    afStack_1688[0] = 0.0013981999;
    afStack_1688[1] = 0.0013981999;
    local_2620 = CONCAT44(fStack_167c + 0.0013981999,local_1680 + 0.0013981999);
    uStack_2618 = CONCAT44(fStack_1674 + 0.0013981999,fStack_1678 + 0.0013981999);
    uStack_2610 = CONCAT44(fStack_166c + 0.0013981999,fStack_1670 + 0.0013981999);
    uStack_2608 = CONCAT44(uStack_2448._4_4_ + 0.0013981999,fStack_1668 + 0.0013981999);
    local_1758 = ::_ps256_cephes_exp_p2;
    local_16e0 = local_2620;
    uStack_16d8 = uStack_2618;
    uStack_16d0 = uStack_2610;
    uStack_16c8 = uStack_2608;
    local_1700 = local_2560;
    uStack_16f8 = uStack_2558;
    uStack_16f0 = uStack_2550;
    uStack_16e8 = uStack_2548;
    fStack_1704 = uStack_2448._4_4_;
    local_1720 = (local_1680 + 0.0013981999) * (float)local_2460;
    fStack_171c = (fStack_167c + 0.0013981999) * local_2460._4_4_;
    fStack_1718 = (fStack_1678 + 0.0013981999) * (float)uStack_2458;
    fStack_1714 = (fStack_1674 + 0.0013981999) * uStack_2458._4_4_;
    fStack_1710 = (fStack_1670 + 0.0013981999) * (float)uStack_2450;
    fStack_170c = (fStack_166c + 0.0013981999) * uStack_2450._4_4_;
    fStack_1708 = (fStack_1668 + 0.0013981999) * (float)uStack_2448;
    local_1740[0] = 0.008333452;
    local_1740[1] = 0.008333452;
    afStack_1738[0] = 0.008333452;
    afStack_1738[1] = 0.008333452;
    afStack_1730[0] = 0.008333452;
    afStack_1730[1] = 0.008333452;
    afStack_1728[0] = 0.008333452;
    afStack_1728[1] = 0.008333452;
    local_2620 = CONCAT44(fStack_171c + 0.008333452,local_1720 + 0.008333452);
    uStack_2618 = CONCAT44(fStack_1714 + 0.008333452,fStack_1718 + 0.008333452);
    uStack_2610 = CONCAT44(fStack_170c + 0.008333452,fStack_1710 + 0.008333452);
    uStack_2608 = CONCAT44(uStack_2448._4_4_ + 0.008333452,fStack_1708 + 0.008333452);
    local_17f8 = ::_ps256_cephes_exp_p3;
    local_1780 = local_2620;
    uStack_1778 = uStack_2618;
    uStack_1770 = uStack_2610;
    uStack_1768 = uStack_2608;
    local_17a0 = local_2560;
    uStack_1798 = uStack_2558;
    uStack_1790 = uStack_2550;
    uStack_1788 = uStack_2548;
    fStack_17a4 = uStack_2448._4_4_;
    local_17c0 = (local_1720 + 0.008333452) * (float)local_2460;
    fStack_17bc = (fStack_171c + 0.008333452) * local_2460._4_4_;
    fStack_17b8 = (fStack_1718 + 0.008333452) * (float)uStack_2458;
    fStack_17b4 = (fStack_1714 + 0.008333452) * uStack_2458._4_4_;
    fStack_17b0 = (fStack_1710 + 0.008333452) * (float)uStack_2450;
    fStack_17ac = (fStack_170c + 0.008333452) * uStack_2450._4_4_;
    fStack_17a8 = (fStack_1708 + 0.008333452) * (float)uStack_2448;
    local_17e0[0] = 0.041665796;
    local_17e0[1] = 0.041665796;
    afStack_17d8[0] = 0.041665796;
    afStack_17d8[1] = 0.041665796;
    afStack_17d0[0] = 0.041665796;
    afStack_17d0[1] = 0.041665796;
    afStack_17c8[0] = 0.041665796;
    afStack_17c8[1] = 0.041665796;
    local_2620 = CONCAT44(fStack_17bc + 0.041665796,local_17c0 + 0.041665796);
    uStack_2618 = CONCAT44(fStack_17b4 + 0.041665796,fStack_17b8 + 0.041665796);
    uStack_2610 = CONCAT44(fStack_17ac + 0.041665796,fStack_17b0 + 0.041665796);
    uStack_2608 = CONCAT44(uStack_2448._4_4_ + 0.041665796,fStack_17a8 + 0.041665796);
    local_1898 = ::_ps256_cephes_exp_p4;
    local_1820 = local_2620;
    uStack_1818 = uStack_2618;
    uStack_1810 = uStack_2610;
    uStack_1808 = uStack_2608;
    local_1840 = local_2560;
    uStack_1838 = uStack_2558;
    uStack_1830 = uStack_2550;
    uStack_1828 = uStack_2548;
    fStack_1844 = uStack_2448._4_4_;
    local_1860 = (local_17c0 + 0.041665796) * (float)local_2460;
    fStack_185c = (fStack_17bc + 0.041665796) * local_2460._4_4_;
    fStack_1858 = (fStack_17b8 + 0.041665796) * (float)uStack_2458;
    fStack_1854 = (fStack_17b4 + 0.041665796) * uStack_2458._4_4_;
    fStack_1850 = (fStack_17b0 + 0.041665796) * (float)uStack_2450;
    fStack_184c = (fStack_17ac + 0.041665796) * uStack_2450._4_4_;
    fStack_1848 = (fStack_17a8 + 0.041665796) * (float)uStack_2448;
    local_1880[0] = 0.16666666;
    local_1880[1] = 0.16666666;
    afStack_1878[0] = 0.16666666;
    afStack_1878[1] = 0.16666666;
    afStack_1870[0] = 0.16666666;
    afStack_1870[1] = 0.16666666;
    afStack_1868[0] = 0.16666666;
    afStack_1868[1] = 0.16666666;
    local_2620 = CONCAT44(fStack_185c + 0.16666666,local_1860 + 0.16666666);
    uStack_2618 = CONCAT44(fStack_1854 + 0.16666666,fStack_1858 + 0.16666666);
    uStack_2610 = CONCAT44(fStack_184c + 0.16666666,fStack_1850 + 0.16666666);
    uStack_2608 = CONCAT44(uStack_2448._4_4_ + 0.16666666,fStack_1848 + 0.16666666);
    local_1938 = ::_ps256_cephes_exp_p5;
    local_18c0 = local_2620;
    uStack_18b8 = uStack_2618;
    uStack_18b0 = uStack_2610;
    uStack_18a8 = uStack_2608;
    local_18e0 = local_2560;
    uStack_18d8 = uStack_2558;
    uStack_18d0 = uStack_2550;
    uStack_18c8 = uStack_2548;
    fStack_18e4 = uStack_2448._4_4_;
    local_1900 = (local_1860 + 0.16666666) * (float)local_2460;
    fStack_18fc = (fStack_185c + 0.16666666) * local_2460._4_4_;
    fStack_18f8 = (fStack_1858 + 0.16666666) * (float)uStack_2458;
    fStack_18f4 = (fStack_1854 + 0.16666666) * uStack_2458._4_4_;
    fStack_18f0 = (fStack_1850 + 0.16666666) * (float)uStack_2450;
    fStack_18ec = (fStack_184c + 0.16666666) * uStack_2450._4_4_;
    fStack_18e8 = (fStack_1848 + 0.16666666) * (float)uStack_2448;
    local_1920[0] = 0.5;
    local_1920[1] = 0.5;
    afStack_1918[0] = 0.5;
    afStack_1918[1] = 0.5;
    afStack_1910[0] = 0.5;
    afStack_1910[1] = 0.5;
    afStack_1908[0] = 0.5;
    afStack_1908[1] = 0.5;
    local_2620 = CONCAT44(fStack_18fc + 0.5,local_1900 + 0.5);
    uStack_2618 = CONCAT44(fStack_18f4 + 0.5,fStack_18f8 + 0.5);
    uStack_2610 = CONCAT44(fStack_18ec + 0.5,fStack_18f0 + 0.5);
    uStack_2608 = CONCAT44(uStack_2448._4_4_ + 0.5,fStack_18e8 + 0.5);
    local_19d0 = &local_2580;
    local_1960 = local_2620;
    uStack_1958 = uStack_2618;
    uStack_1950 = uStack_2610;
    uStack_1948 = uStack_2608;
    local_1980 = local_2580;
    uStack_1978 = uStack_2578;
    uStack_2570 = auVar58._16_8_;
    uStack_1970 = uStack_2570;
    uStack_2568 = auVar2._24_8_;
    uStack_1968 = uStack_2568;
    fStack_1984 = uStack_2448._4_4_;
    local_19a0 = (local_1900 + 0.5) * (float)local_2460 * (float)local_2460;
    fStack_199c = (fStack_18fc + 0.5) * local_2460._4_4_ * local_2460._4_4_;
    fStack_1998 = (fStack_18f8 + 0.5) * (float)uStack_2458 * (float)uStack_2458;
    fStack_1994 = (fStack_18f4 + 0.5) * uStack_2458._4_4_ * uStack_2458._4_4_;
    fStack_1990 = (fStack_18f0 + 0.5) * (float)uStack_2450 * (float)uStack_2450;
    fStack_198c = (fStack_18ec + 0.5) * uStack_2450._4_4_ * uStack_2450._4_4_;
    fStack_1988 = (fStack_18e8 + 0.5) * (float)uStack_2448 * (float)uStack_2448;
    local_19c0 = local_2560;
    uStack_19b8 = uStack_2558;
    uStack_19b0 = uStack_2550;
    uStack_19a8 = uStack_2548;
    local_2620 = CONCAT44(fStack_199c + local_2460._4_4_,local_19a0 + (float)local_2460);
    uStack_2618 = CONCAT44(fStack_1994 + uStack_2458._4_4_,fStack_1998 + (float)uStack_2458);
    uStack_2610 = CONCAT44(fStack_198c + uStack_2450._4_4_,fStack_1990 + (float)uStack_2450);
    uStack_2608 = CONCAT44(uStack_2448._4_4_ + uStack_2448._4_4_,fStack_1988 + (float)uStack_2448);
    local_2520 = local_2620;
    uStack_2518 = uStack_2618;
    uStack_2510 = uStack_2610;
    uStack_2508 = uStack_2608;
    local_2540 = 0x3f8000003f800000;
    uStack_2538 = 0x3f8000003f800000;
    uStack_2530 = 0x3f8000003f800000;
    uStack_2528 = 0x3f8000003f800000;
    fVar61 = local_19a0 + (float)local_2460 + 1.0;
    fVar62 = fStack_199c + local_2460._4_4_ + 1.0;
    fVar63 = fStack_1998 + (float)uStack_2458 + 1.0;
    fVar64 = fStack_1994 + uStack_2458._4_4_ + 1.0;
    fVar65 = fStack_1990 + (float)uStack_2450 + 1.0;
    fVar66 = fStack_198c + uStack_2450._4_4_ + 1.0;
    fVar59 = fStack_1988 + (float)uStack_2448 + 1.0;
    fVar60 = uStack_2448._4_4_ + uStack_2448._4_4_ + 1.0;
    local_2620 = CONCAT44(fVar62,fVar61);
    uStack_2618 = CONCAT44(fVar64,fVar63);
    uStack_2610 = CONCAT44(fVar66,fVar65);
    uStack_2608 = CONCAT44(fVar60,fVar59);
    local_12a0 = local_25a0;
    uStack_1298 = uStack_2598;
    uStack_1290 = uStack_2590;
    uStack_1288 = uStack_2588;
    local_25c0 = CONCAT44((int)local_12c0._4_4_,(int)(float)local_12c0);
    uStack_25b8 = CONCAT44((int)uStack_12b8._4_4_,(int)(float)uStack_12b8);
    uStack_25b0 = CONCAT44((int)uStack_12b0._4_4_,(int)(float)uStack_12b0);
    uStack_25a8 = CONCAT44((int)uStack_12a8._4_4_,(int)(float)uStack_12a8);
    local_11a0 = local_25c0;
    uStack_1198 = uStack_25b8;
    uStack_1190 = uStack_25b0;
    uStack_1188 = uStack_25a8;
    local_1240 = local_25c0;
    uStack_1238 = uStack_25b8;
    uStack_1230 = uStack_25b0;
    uStack_1228 = uStack_25a8;
    local_1260 = 0x7f0000007f;
    uStack_1258 = 0x7f0000007f;
    uStack_1250 = 0x7f0000007f;
    uStack_1248 = 0x7f0000007f;
    local_11f0 = 0x7f0000007f;
    uStack_11e8 = 0x7f0000007f;
    local_1200 = 0x7f0000007f;
    uStack_11f8 = 0x7f0000007f;
    local_1070 = local_25c0;
    uStack_1068 = uStack_25b8;
    local_1080 = 0x7f0000007f;
    uStack_1078 = 0x7f0000007f;
    auVar32._8_8_ = uStack_25b8;
    auVar32._0_8_ = local_25c0;
    auVar5._8_8_ = 0x7f0000007f;
    auVar5._0_8_ = 0x7f0000007f;
    local_11d0 = vpaddd_avx(auVar32,auVar5);
    local_1090 = uStack_25b0;
    uStack_1088 = uStack_25a8;
    local_10a0 = 0x7f0000007f;
    uStack_1098 = 0x7f0000007f;
    auVar4._8_8_ = uStack_25a8;
    auVar4._0_8_ = uStack_25b0;
    auVar1._8_8_ = 0x7f0000007f;
    auVar1._0_8_ = 0x7f0000007f;
    local_11e0 = vpaddd_avx(auVar4,auVar1);
    local_1280 = local_11d0._0_8_;
    uStack_1278 = local_11d0._8_8_;
    uStack_1270 = local_11e0._0_8_;
    uStack_1268 = local_11e0._8_8_;
    local_1220 = local_11d0._0_8_;
    uStack_1218 = local_11d0._8_8_;
    uStack_1210 = local_11e0._0_8_;
    uStack_1208 = local_11e0._8_8_;
    local_10e0 = local_11d0._0_8_;
    uStack_10d8 = local_11d0._8_8_;
    uStack_10d0 = local_11e0._0_8_;
    uStack_10c8 = local_11e0._8_8_;
    local_10e4 = 0x17;
    local_1160 = local_11d0._0_8_;
    uStack_1158 = local_11d0._8_8_;
    uStack_1150 = local_11e0._0_8_;
    uStack_1148 = local_11e0._8_8_;
    local_1030 = local_11d0._0_8_;
    uStack_1028 = local_11d0._8_8_;
    local_1034 = 0x17;
    local_1100 = vpslld_avx(local_11d0,ZEXT416(0x17));
    local_1050 = local_11e0._0_8_;
    uStack_1048 = local_11e0._8_8_;
    local_1054 = 0x17;
    local_1110 = vpslld_avx(local_11e0,ZEXT416(0x17));
    local_1180 = local_1100._0_8_;
    uStack_1178 = local_1100._8_8_;
    uStack_1170 = local_1110._0_8_;
    uStack_1168 = local_1110._8_8_;
    local_1140 = local_1100._0_8_;
    uStack_1138 = local_1100._8_8_;
    uStack_1130 = local_1110._0_8_;
    uStack_1128 = local_1110._8_8_;
    local_25c0 = local_1100._0_8_;
    uStack_25b8 = local_1100._8_8_;
    uStack_25b0 = local_1110._0_8_;
    uStack_25a8 = local_1110._8_8_;
    local_10c0 = local_1100._0_8_;
    uStack_10b8 = local_1100._8_8_;
    uStack_10b0 = local_1110._0_8_;
    uStack_10a8 = local_1110._8_8_;
    local_2640 = local_1100._0_8_;
    uStack_2638 = local_1100._8_8_;
    uStack_2630 = local_1110._0_8_;
    uStack_2628 = local_1110._8_8_;
    local_24a0 = local_2620;
    uStack_2498 = uStack_2618;
    uStack_2490 = uStack_2610;
    uStack_2488 = uStack_2608;
    local_24c0._0_4_ = local_1100._0_4_;
    local_24c0._4_4_ = local_1100._4_4_;
    uStack_24b8._0_4_ = local_1100._8_4_;
    uStack_24b8._4_4_ = local_1100._12_4_;
    uStack_24b0._0_4_ = local_1110._0_4_;
    uStack_24b0._4_4_ = local_1110._4_4_;
    uStack_24a8._0_4_ = local_1110._8_4_;
    local_2620 = CONCAT44(fVar62 * local_24c0._4_4_,fVar61 * (float)local_24c0);
    uStack_2618 = CONCAT44(fVar64 * uStack_24b8._4_4_,fVar63 * (float)uStack_24b8);
    uStack_2610 = CONCAT44(fVar66 * uStack_24b0._4_4_,fVar65 * (float)uStack_24b0);
    uStack_2608 = CONCAT44(fVar60,fVar59 * (float)uStack_24a8);
    local_2840 = local_2620;
    uStack_2838 = uStack_2618;
    uStack_2830 = uStack_2610;
    uStack_2828 = uStack_2608;
    local_2748 = local_27a8;
    local_2780 = local_2620;
    uStack_2778 = uStack_2618;
    uStack_2770 = uStack_2610;
    uStack_2768 = uStack_2608;
    *(undefined8 *)local_27a8 = local_2620;
    *(undefined8 *)(local_27a8 + 2) = uStack_2618;
    *(undefined8 *)(local_27a8 + 4) = uStack_2610;
    *(undefined8 *)(local_27a8 + 6) = uStack_2608;
    local_27a0 = local_27a0 + 1;
    local_27a8 = local_27a8 + 8;
    local_26a0 = local_2820;
    uStack_2698 = uStack_2818;
    uStack_2690 = uStack_2810;
    uStack_2688 = uStack_2808;
    local_2680 = local_23c0;
    uStack_2678 = uStack_23b8;
    uStack_2670 = uStack_23b0;
    uStack_2668 = uStack_23a8;
    local_2660 = local_26c0;
    uStack_2658 = uStack_26b8;
    uStack_2650 = uStack_26b0;
    uStack_2648 = uStack_26a8;
    _local_2580 = auVar2;
    local_24c0 = local_1100._0_8_;
    uStack_24b8 = local_1100._8_8_;
    uStack_24b0 = local_1110._0_8_;
    uStack_24a8 = local_1110._8_8_;
    local_2460 = local_2480;
    uStack_2458 = uStack_2478;
    uStack_2450 = uStack_2470;
    uStack_2448 = uStack_2468;
    local_2300 = local_25e0;
    uStack_22f8 = uStack_25d8;
    uStack_22f0 = uStack_25d0;
    uStack_22e8 = uStack_25c8;
    _local_22c0 = auVar23;
    local_22a0 = uVar15;
    uStack_2298 = uVar16;
    uStack_2290 = uVar17;
    uStack_2288 = uVar18;
    local_2260 = local_2380._0_8_;
    uStack_2258 = local_2380._8_8_;
    uStack_2250 = local_2380._16_8_;
    uStack_2248 = local_2380._24_8_;
    local_2240 = uVar11;
    uStack_2238 = uVar12;
    uStack_2230 = uVar13;
    uStack_2228 = uVar14;
    local_2200 = uVar7;
    uStack_21f8 = uVar8;
    uStack_21f0 = uVar9;
    uStack_21e8 = uVar10;
    local_20c0 = local_20e0;
    uStack_20b8 = uStack_20d8;
    uStack_20b0 = uStack_20d0;
    uStack_20a8 = uStack_20c8;
    uStack_2070 = uStack_2810;
    uStack_2068 = uStack_2808;
    local_1f68 = local_2008;
    local_1f00 = local_2340;
    uStack_1ef8 = uStack_2338;
    uStack_1ef0 = uStack_2330;
    uStack_1ee8 = uStack_2328;
    local_1ed0 = local_2018;
    local_1ec8 = local_1f78;
    fStack_1e84 = fStack_2384;
    local_1e30 = local_2018;
    local_1e28 = local_1f78;
    fStack_1de4 = fStack_2384;
    local_1d90 = local_2018;
    local_1d88 = local_1f78;
    fStack_1d44 = fStack_2384;
    local_1cf0 = local_2018;
    local_1ce8 = local_1f78;
    fStack_1ca4 = fStack_2384;
    local_1c50 = local_2018;
    local_1c48 = local_1f78;
    fStack_1c04 = fStack_2384;
    local_1bb0 = local_2018;
    local_1ba8 = local_1f78;
    fStack_1b64 = fStack_2384;
    local_1b10 = local_2018;
    local_1b08 = local_1f78;
    fStack_1ac4 = fStack_2384;
    local_1a70 = local_2018;
    local_1a68 = local_1f78;
    fStack_1a24 = fStack_2384;
    local_1930 = local_19d8;
    local_1928 = local_19c8;
    local_1890 = local_19d8;
    local_1888 = local_19c8;
    local_17f0 = local_19d8;
    local_17e8 = local_19c8;
    local_1750 = local_19d8;
    local_1748 = local_19c8;
    local_16b0 = local_19d8;
    local_16a8 = local_19c8;
    local_1608 = local_19d8;
    local_15a0 = uVar19;
    uStack_1598 = uVar20;
    uStack_1590 = uVar21;
    uStack_1588 = uVar22;
    local_1478 = local_1f78;
    fStack_1444 = fStack_2384;
    local_13d8 = local_19d8;
    local_1338 = local_19d8;
    local_1328 = local_13c8;
    local_12c0 = local_25a0;
    uStack_12b8 = uStack_2598;
    uStack_12b0 = uStack_2590;
    uStack_12a8 = uStack_2588;
    local_e00 = local_11c0;
    uStack_df8 = uStack_11b8;
    uStack_df0 = uStack_11b0;
    uStack_de8 = uStack_11a8;
  }
  for (; local_27ac = in_ECX, local_27bc + 3 < in_ECX; local_27bc = local_27bc + 4) {
    local_2740 = local_27a0;
    local_2850 = *(undefined8 *)*local_27a0;
    uStack_2848 = *(undefined8 *)(*local_27a0 + 8);
    local_d08 = local_27b1;
    local_d10 = &local_27d0;
    local_d18 = &local_2850;
    local_d00 = local_2870;
    uStack_cf8 = uStack_2868;
    local_c90 = 0x3f8000003f800000;
    uStack_c88 = 0x3f8000003f800000;
    local_910 = 0;
    uStack_908 = 0;
    local_e0 = 0;
    uStack_d8 = 0;
    local_ab0 = vcmpps_avx(*(undefined1 (*) [16])*local_27a0,ZEXT816(0),2);
    local_970 = 0x80000000800000;
    uStack_968 = 0x80000000800000;
    auVar45._8_8_ = 0x80000000800000;
    auVar45._0_8_ = 0x80000000800000;
    auVar1 = vmaxps_avx(*(undefined1 (*) [16])*local_27a0,auVar45);
    local_a80 = auVar1._0_8_;
    local_c0 = local_a80;
    uStack_a78 = auVar1._8_8_;
    uStack_b8 = uStack_a78;
    local_940 = local_a80;
    uStack_938 = uStack_a78;
    local_944 = 0x17;
    auVar5 = vpsrld_avx(auVar1,ZEXT416(0x17));
    local_840 = local_a80;
    uStack_838 = uStack_a78;
    local_850 = 0x807fffff807fffff;
    uStack_848 = 0x807fffff807fffff;
    auVar50._8_8_ = 0x807fffff807fffff;
    auVar50._0_8_ = 0x807fffff807fffff;
    auVar1 = vpand_avx(auVar1,auVar50);
    local_a80 = auVar1._0_8_;
    local_80 = local_a80;
    uStack_a78 = auVar1._8_8_;
    uStack_78 = uStack_a78;
    local_c20 = 0x3f0000003f000000;
    uStack_c18 = 0x3f0000003f000000;
    auVar56._8_8_ = 0x3f0000003f000000;
    auVar56._0_8_ = 0x3f0000003f000000;
    auVar4 = vpor_avx(auVar1,auVar56);
    local_a90._0_8_ = auVar5._0_8_;
    local_920 = local_a90._0_8_;
    local_a90._8_8_ = auVar5._8_8_;
    uStack_918 = local_a90._8_8_;
    local_b40 = 0x7f0000007f;
    uStack_b38 = 0x7f0000007f;
    auVar46._8_8_ = 0x7f0000007f;
    auVar46._0_8_ = 0x7f0000007f;
    local_a90 = vpsubd_avx(auVar5,auVar46);
    local_8d0 = local_a90._0_8_;
    uStack_8c8 = local_a90._8_8_;
    auVar1 = vcvtdq2ps_avx(local_a90);
    local_ac0 = auVar1._0_8_;
    uVar7 = local_ac0;
    uStack_ab8 = auVar1._8_8_;
    uVar8 = uStack_ab8;
    local_a30 = 0x3f8000003f800000;
    uStack_a28 = 0x3f8000003f800000;
    local_a20._0_4_ = auVar1._0_4_;
    local_a20._4_4_ = auVar1._4_4_;
    uStack_a18._0_4_ = auVar1._8_4_;
    uStack_a18._4_4_ = auVar1._12_4_;
    local_ac0._4_4_ = local_a20._4_4_ + 1.0;
    local_ac0._0_4_ = (float)local_a20 + 1.0;
    uStack_ab8._0_4_ = (float)uStack_a18 + 1.0;
    uStack_ab8._4_4_ = uStack_a18._4_4_ + 1.0;
    local_a80 = auVar4._0_8_;
    local_60 = local_a80;
    uStack_a78 = auVar4._8_8_;
    uStack_58 = uStack_a78;
    local_70 = 0x3f3504f33f3504f3;
    uStack_68 = 0x3f3504f33f3504f3;
    auVar57._8_8_ = 0x3f3504f33f3504f3;
    auVar57._0_8_ = 0x3f3504f33f3504f3;
    local_ad0 = vcmpps_avx(auVar4,auVar57,1);
    local_860 = local_a80;
    uStack_858 = uStack_a78;
    local_870 = local_ad0._0_8_;
    uStack_868 = local_ad0._8_8_;
    local_ae0 = vpand_avx(auVar4,local_ad0);
    local_9e0 = local_a80;
    uStack_9d8 = uStack_a78;
    local_9f0 = 0x3f8000003f800000;
    uStack_9e8 = 0x3f8000003f800000;
    auVar44._8_8_ = 0x3f8000003f800000;
    auVar44._0_8_ = 0x3f8000003f800000;
    auVar1 = vsubps_avx(auVar4,auVar44);
    local_a00 = local_ac0;
    uStack_9f8 = uStack_ab8;
    local_880 = 0x3f8000003f800000;
    uStack_878 = 0x3f8000003f800000;
    local_890 = local_ad0._0_8_;
    uStack_888 = local_ad0._8_8_;
    auVar49._8_8_ = 0x3f8000003f800000;
    auVar49._0_8_ = 0x3f8000003f800000;
    local_a10 = vpand_avx(auVar49,local_ad0);
    auVar43._8_8_ = uStack_ab8;
    auVar43._0_8_ = local_ac0;
    _local_ac0 = vsubps_avx(auVar43,local_a10);
    local_a80 = auVar1._0_8_;
    uVar9 = local_a80;
    uStack_a78 = auVar1._8_8_;
    uVar10 = uStack_a78;
    local_a40._0_4_ = auVar1._0_4_;
    local_a40._4_4_ = auVar1._4_4_;
    uStack_a38._0_4_ = auVar1._8_4_;
    uStack_a38._4_4_ = auVar1._12_4_;
    local_a50._0_4_ = local_ae0._0_4_;
    local_a50._4_4_ = local_ae0._4_4_;
    uStack_a48._0_4_ = local_ae0._8_4_;
    uStack_a48._4_4_ = local_ae0._12_4_;
    local_a40._0_4_ = (float)local_a40 + (float)local_a50;
    local_a40._4_4_ = local_a40._4_4_ + local_a50._4_4_;
    uStack_a38._0_4_ = (float)uStack_a38 + (float)uStack_a48;
    uStack_a38._4_4_ = uStack_a38._4_4_ + uStack_a48._4_4_;
    local_a80._4_4_ = local_a40._4_4_;
    local_a80._0_4_ = (float)local_a40;
    uStack_a78._0_4_ = (float)uStack_a38;
    uStack_a78._4_4_ = uStack_a38._4_4_;
    local_990 = local_a80;
    uStack_988 = uStack_a78;
    local_af0 = (float)local_a40 * (float)local_a40;
    fStack_aec = local_a40._4_4_ * local_a40._4_4_;
    fStack_ae8 = (float)uStack_a38 * (float)uStack_a38;
    fStack_ae4 = uStack_a38._4_4_ * uStack_a38._4_4_;
    local_808 = local_b00;
    local_6e8 = local_a80;
    local_388 = ::_ps_cephes_log_p1;
    local_340 = 0x3d9021bb3d9021bb;
    uStack_338 = 0x3d9021bb3d9021bb;
    local_350 = local_a80;
    uStack_348 = uStack_a78;
    local_360 = (float)local_a40 * 0.070376836;
    fStack_35c = local_a40._4_4_ * 0.070376836;
    fStack_358 = (float)uStack_a38 * 0.070376836;
    fStack_354 = uStack_a38._4_4_ * 0.070376836;
    local_370[0] = -0.1151461;
    local_370[1] = -0.1151461;
    afStack_368[0] = -0.1151461;
    afStack_368[1] = -0.1151461;
    local_b00._4_4_ = fStack_35c + -0.1151461;
    local_b00._0_4_ = local_360 + -0.1151461;
    uStack_af8._0_4_ = fStack_358 + -0.1151461;
    uStack_af8._4_4_ = fStack_354 + -0.1151461;
    local_3e8 = ::_ps_cephes_log_p2;
    local_3a0 = local_b00;
    uStack_398 = uStack_af8;
    local_3b0 = local_a80;
    uStack_3a8 = uStack_a78;
    local_3c0 = (local_360 + -0.1151461) * (float)local_a40;
    fStack_3bc = (fStack_35c + -0.1151461) * local_a40._4_4_;
    fStack_3b8 = (fStack_358 + -0.1151461) * (float)uStack_a38;
    fStack_3b4 = (fStack_354 + -0.1151461) * uStack_a38._4_4_;
    local_3d0[0] = 0.116769984;
    local_3d0[1] = 0.116769984;
    afStack_3c8[0] = 0.116769984;
    afStack_3c8[1] = 0.116769984;
    local_b00._4_4_ = fStack_3bc + 0.116769984;
    local_b00._0_4_ = local_3c0 + 0.116769984;
    uStack_af8._0_4_ = fStack_3b8 + 0.116769984;
    uStack_af8._4_4_ = fStack_3b4 + 0.116769984;
    local_448 = ::_ps_cephes_log_p3;
    local_400 = local_b00;
    uStack_3f8 = uStack_af8;
    local_410 = local_a80;
    uStack_408 = uStack_a78;
    local_420 = (local_3c0 + 0.116769984) * (float)local_a40;
    fStack_41c = (fStack_3bc + 0.116769984) * local_a40._4_4_;
    fStack_418 = (fStack_3b8 + 0.116769984) * (float)uStack_a38;
    fStack_414 = (fStack_3b4 + 0.116769984) * uStack_a38._4_4_;
    local_430[0] = -0.12420141;
    local_430[1] = -0.12420141;
    afStack_428[0] = -0.12420141;
    afStack_428[1] = -0.12420141;
    local_b00._4_4_ = fStack_41c + -0.12420141;
    local_b00._0_4_ = local_420 + -0.12420141;
    uStack_af8._0_4_ = fStack_418 + -0.12420141;
    uStack_af8._4_4_ = fStack_414 + -0.12420141;
    local_4a8 = ::_ps_cephes_log_p4;
    local_460 = local_b00;
    uStack_458 = uStack_af8;
    local_470 = local_a80;
    uStack_468 = uStack_a78;
    local_480 = (local_420 + -0.12420141) * (float)local_a40;
    fStack_47c = (fStack_41c + -0.12420141) * local_a40._4_4_;
    fStack_478 = (fStack_418 + -0.12420141) * (float)uStack_a38;
    fStack_474 = (fStack_414 + -0.12420141) * uStack_a38._4_4_;
    local_490[0] = 0.14249323;
    local_490[1] = 0.14249323;
    afStack_488[0] = 0.14249323;
    afStack_488[1] = 0.14249323;
    local_b00._4_4_ = fStack_47c + 0.14249323;
    local_b00._0_4_ = local_480 + 0.14249323;
    uStack_af8._0_4_ = fStack_478 + 0.14249323;
    uStack_af8._4_4_ = fStack_474 + 0.14249323;
    local_508 = ::_ps_cephes_log_p5;
    local_4c0 = local_b00;
    uStack_4b8 = uStack_af8;
    local_4d0 = local_a80;
    uStack_4c8 = uStack_a78;
    local_4e0 = (local_480 + 0.14249323) * (float)local_a40;
    fStack_4dc = (fStack_47c + 0.14249323) * local_a40._4_4_;
    fStack_4d8 = (fStack_478 + 0.14249323) * (float)uStack_a38;
    fStack_4d4 = (fStack_474 + 0.14249323) * uStack_a38._4_4_;
    local_4f0[0] = -0.16668057;
    local_4f0[1] = -0.16668057;
    afStack_4e8[0] = -0.16668057;
    afStack_4e8[1] = -0.16668057;
    local_b00._4_4_ = fStack_4dc + -0.16668057;
    local_b00._0_4_ = local_4e0 + -0.16668057;
    uStack_af8._0_4_ = fStack_4d8 + -0.16668057;
    uStack_af8._4_4_ = fStack_4d4 + -0.16668057;
    local_568 = ::_ps_cephes_log_p6;
    local_520 = local_b00;
    uStack_518 = uStack_af8;
    local_530 = local_a80;
    uStack_528 = uStack_a78;
    local_540 = (local_4e0 + -0.16668057) * (float)local_a40;
    fStack_53c = (fStack_4dc + -0.16668057) * local_a40._4_4_;
    fStack_538 = (fStack_4d8 + -0.16668057) * (float)uStack_a38;
    fStack_534 = (fStack_4d4 + -0.16668057) * uStack_a38._4_4_;
    local_550[0] = 0.20000714;
    local_550[1] = 0.20000714;
    afStack_548[0] = 0.20000714;
    afStack_548[1] = 0.20000714;
    local_b00._4_4_ = fStack_53c + 0.20000714;
    local_b00._0_4_ = local_540 + 0.20000714;
    uStack_af8._0_4_ = fStack_538 + 0.20000714;
    uStack_af8._4_4_ = fStack_534 + 0.20000714;
    local_5c8 = ::_ps_cephes_log_p7;
    local_580 = local_b00;
    uStack_578 = uStack_af8;
    local_590 = local_a80;
    uStack_588 = uStack_a78;
    local_5a0 = (local_540 + 0.20000714) * (float)local_a40;
    fStack_59c = (fStack_53c + 0.20000714) * local_a40._4_4_;
    fStack_598 = (fStack_538 + 0.20000714) * (float)uStack_a38;
    fStack_594 = (fStack_534 + 0.20000714) * uStack_a38._4_4_;
    local_5b0[0] = -0.24999994;
    local_5b0[1] = -0.24999994;
    afStack_5a8[0] = -0.24999994;
    afStack_5a8[1] = -0.24999994;
    local_b00._4_4_ = fStack_59c + -0.24999994;
    local_b00._0_4_ = local_5a0 + -0.24999994;
    uStack_af8._0_4_ = fStack_598 + -0.24999994;
    uStack_af8._4_4_ = fStack_594 + -0.24999994;
    local_628 = ::_ps_cephes_log_p8;
    local_5e0 = local_b00;
    uStack_5d8 = uStack_af8;
    local_5f0 = local_a80;
    uStack_5e8 = uStack_a78;
    local_600 = (local_5a0 + -0.24999994) * (float)local_a40;
    fStack_5fc = (fStack_59c + -0.24999994) * local_a40._4_4_;
    fStack_5f8 = (fStack_598 + -0.24999994) * (float)uStack_a38;
    fStack_5f4 = (fStack_594 + -0.24999994) * uStack_a38._4_4_;
    local_610[0] = 0.3333333;
    local_610[1] = 0.3333333;
    afStack_608[0] = 0.3333333;
    afStack_608[1] = 0.3333333;
    local_b00._4_4_ = fStack_5fc + 0.3333333;
    local_b00._0_4_ = local_600 + 0.3333333;
    uStack_af8._0_4_ = fStack_5f8 + 0.3333333;
    uStack_af8._4_4_ = fStack_5f4 + 0.3333333;
    local_9a0 = local_b00;
    uStack_998 = uStack_af8;
    local_9b0 = local_a80;
    uStack_9a8 = uStack_a78;
    local_b00._0_4_ = (local_600 + 0.3333333) * (float)local_a40;
    local_b00._4_4_ = (fStack_5fc + 0.3333333) * local_a40._4_4_;
    fVar61 = (fStack_5f8 + 0.3333333) * (float)uStack_a38;
    fVar62 = (fStack_5f4 + 0.3333333) * uStack_a38._4_4_;
    uStack_af8._0_4_ = fVar61;
    uStack_af8._4_4_ = fVar62;
    local_9c0 = local_b00;
    uStack_9b8 = uStack_af8;
    local_9d0 = CONCAT44(fStack_aec,local_af0);
    uStack_9c8 = CONCAT44(fStack_ae4,fStack_ae8);
    local_b00._0_4_ = (float)local_b00._0_4_ * local_af0;
    local_b00._4_4_ = (float)local_b00._4_4_ * fStack_aec;
    fVar61 = fVar61 * fStack_ae8;
    fVar62 = fVar62 * fStack_ae4;
    uStack_af8._0_4_ = fVar61;
    uStack_af8._4_4_ = fVar62;
    local_6d8 = local_ac0;
    local_680 = ::_ps_cephes_log_q1;
    local_650[0] = -0.00021219444;
    local_650[1] = -0.00021219444;
    afStack_648[0] = -0.00021219444;
    afStack_648[1] = -0.00021219444;
    local_640._0_4_ = local_ac0._0_4_;
    local_640._4_4_ = local_ac0._4_4_;
    uStack_638._0_4_ = local_ac0._8_4_;
    uStack_638._4_4_ = local_ac0._12_4_;
    local_660 = (float)local_640 * -0.00021219444;
    fStack_65c = local_640._4_4_ * -0.00021219444;
    fStack_658 = (float)uStack_638 * -0.00021219444;
    fStack_654 = uStack_638._4_4_ * -0.00021219444;
    local_670 = local_b00;
    uStack_668 = uStack_af8;
    local_b00._4_4_ = fStack_65c + (float)local_b00._4_4_;
    local_b00._0_4_ = local_660 + (float)local_b00._0_4_;
    uStack_af8._0_4_ = fStack_658 + fVar61;
    uStack_af8._4_4_ = fStack_654 + fVar62;
    local_7f8 = &local_af0;
    local_800 = ::_ps_0p5;
    local_7e0 = local_b00;
    uStack_7d8 = uStack_af8;
    local_7c0 = CONCAT44(fStack_aec,local_af0);
    uStack_7b8 = CONCAT44(fStack_ae4,fStack_ae8);
    local_7d0[0] = 0.5;
    local_7d0[1] = 0.5;
    afStack_7c8[0] = 0.5;
    afStack_7c8[1] = 0.5;
    local_7f0 = local_af0 * 0.5;
    fStack_7ec = fStack_aec * 0.5;
    fStack_7e8 = fStack_ae8 * 0.5;
    fStack_7e4 = fStack_ae4 * 0.5;
    auVar52._4_4_ = fStack_7ec;
    auVar52._0_4_ = local_7f0;
    auVar52._8_4_ = fStack_7e8;
    auVar52._12_4_ = fStack_7e4;
    _local_b00 = vsubps_avx(_local_b00,auVar52);
    local_a60 = local_a80;
    uStack_a58 = uStack_a78;
    local_a70._0_4_ = local_b00._0_4_;
    local_a70._4_4_ = local_b00._4_4_;
    uStack_a68._0_4_ = local_b00._8_4_;
    uStack_a68._4_4_ = local_b00._12_4_;
    local_a80._4_4_ = local_a40._4_4_ + local_a70._4_4_;
    local_a80._0_4_ = (float)local_a40 + (float)local_a70;
    uStack_a78._0_4_ = (float)uStack_a38 + (float)uStack_a68;
    uStack_a78._4_4_ = uStack_a38._4_4_ + uStack_a68._4_4_;
    local_6e0 = ::_ps_cephes_log_q2;
    local_6a0 = local_ac0;
    uStack_698 = uStack_ab8;
    local_6b0[0] = 0.6933594;
    local_6b0[1] = 0.6933594;
    afStack_6a8[0] = 0.6933594;
    afStack_6a8[1] = 0.6933594;
    local_6c0 = (float)local_640 * 0.6933594;
    fStack_6bc = local_640._4_4_ * 0.6933594;
    fStack_6b8 = (float)uStack_638 * 0.6933594;
    fStack_6b4 = uStack_638._4_4_ * 0.6933594;
    local_6d0 = local_a80;
    uStack_6c8 = uStack_a78;
    local_a80._4_4_ = fStack_6bc + local_a40._4_4_ + local_a70._4_4_;
    local_a80._0_4_ = local_6c0 + (float)local_a40 + (float)local_a70;
    uStack_a78._0_4_ = fStack_6b8 + (float)uStack_a38 + (float)uStack_a68;
    uStack_a78._4_4_ = fStack_6b4 + uStack_a38._4_4_ + uStack_a68._4_4_;
    local_a0 = local_a80;
    uStack_98 = uStack_a78;
    local_b0 = local_ab0._0_8_;
    uStack_a8 = local_ab0._8_8_;
    auVar55._8_8_ = uStack_a78;
    auVar55._0_8_ = local_a80;
    _local_a80 = vpor_avx(auVar55,local_ab0);
    local_cd0._0_4_ = (float)local_2870;
    local_cd0._4_4_ = (float)((ulong)local_2870 >> 0x20);
    uStack_cc8._0_4_ = (float)uStack_2868;
    uStack_cc8._4_4_ = (float)((ulong)uStack_2868 >> 0x20);
    local_ce0._0_4_ = local_a80._0_4_;
    local_ce0._4_4_ = local_a80._4_4_;
    uStack_cd8._0_4_ = local_a80._8_4_;
    uStack_cd8._4_4_ = local_a80._12_4_;
    local_c50._4_4_ = local_cd0._4_4_ * local_ce0._4_4_;
    local_c50._0_4_ = (float)local_cd0 * (float)local_ce0;
    uStack_c48._0_4_ = (float)uStack_cc8 * (float)uStack_cd8;
    uStack_c48._4_4_ = uStack_cc8._4_4_ * uStack_cd8._4_4_;
    local_900 = 0;
    uStack_8f8 = 0;
    local_b50 = local_c50;
    uStack_b48 = uStack_c48;
    local_b60 = 0x42b0c0a542b0c0a5;
    uStack_b58 = 0x42b0c0a542b0c0a5;
    auVar40._8_8_ = uStack_c48;
    auVar40._0_8_ = local_c50;
    auVar39._8_8_ = 0x42b0c0a542b0c0a5;
    auVar39._0_8_ = 0x42b0c0a542b0c0a5;
    auVar1 = vminps_avx(auVar40,auVar39);
    local_c50 = auVar1._0_8_;
    local_b70 = local_c50;
    uStack_c48 = auVar1._8_8_;
    uStack_b68 = uStack_c48;
    local_b80 = 0xc2b0c0a5c2b0c0a5;
    uStack_b78 = 0xc2b0c0a5c2b0c0a5;
    auVar38._8_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar38._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar5 = vmaxps_avx(auVar1,auVar38);
    local_c50 = auVar5._0_8_;
    uVar11 = local_c50;
    uStack_c48 = auVar5._8_8_;
    uVar12 = uStack_c48;
    local_ba0 = 0x3fb8aa3b3fb8aa3b;
    uStack_b98 = 0x3fb8aa3b3fb8aa3b;
    local_b90._0_4_ = auVar5._0_4_;
    local_b90._4_4_ = auVar5._4_4_;
    uStack_b88._0_4_ = auVar5._8_4_;
    uStack_b88._4_4_ = auVar5._12_4_;
    local_c70._4_4_ = local_b90._4_4_ * 1.442695;
    local_c70._0_4_ = (float)local_b90 * 1.442695;
    uStack_c68._0_4_ = (float)uStack_b88 * 1.442695;
    uStack_c68._4_4_ = uStack_b88._4_4_ * 1.442695;
    local_c10 = local_c70;
    uStack_c08 = uStack_c68;
    local_c70._0_4_ = (float)local_b90 * 1.442695 + 0.5;
    local_c70._4_4_ = local_b90._4_4_ * 1.442695 + 0.5;
    fVar61 = (float)uStack_b88 * 1.442695 + 0.5;
    fVar62 = uStack_b88._4_4_ * 1.442695 + 0.5;
    uStack_c68._0_4_ = fVar61;
    uStack_c68._4_4_ = fVar62;
    local_8e0 = local_c70;
    uStack_8d8 = uStack_c68;
    local_c80._4_4_ = (int)(float)local_c70._4_4_;
    local_c80._0_4_ = (int)(float)local_c70._0_4_;
    local_c80._8_4_ = (int)fVar61;
    local_c80._12_4_ = (int)fVar62;
    local_8c0 = local_c80._0_8_;
    uStack_8b8 = local_c80._8_8_;
    auVar47._8_8_ = local_c80._8_8_;
    auVar47._0_8_ = local_c80._0_8_;
    auVar4 = vcvtdq2ps_avx(auVar47);
    local_c60 = auVar4._0_8_;
    local_8a0 = local_c60;
    uStack_c58 = auVar4._8_8_;
    uStack_898 = uStack_c58;
    local_8b0 = local_c70;
    uStack_8a8 = uStack_c68;
    auVar48._8_8_ = uStack_c68;
    auVar48._0_8_ = local_c70;
    auVar1 = vcmpps_avx(auVar48,auVar4,1);
    local_ca0._0_8_ = auVar1._0_8_;
    local_820 = local_ca0._0_8_;
    local_ca0._8_8_ = auVar1._8_8_;
    uStack_818 = local_ca0._8_8_;
    local_830 = 0x3f8000003f800000;
    uStack_828 = 0x3f8000003f800000;
    auVar51._8_8_ = 0x3f8000003f800000;
    auVar51._0_8_ = 0x3f8000003f800000;
    local_ca0 = vpand_avx(auVar1,auVar51);
    local_bf0 = local_c60;
    uStack_be8 = uStack_c58;
    local_c00 = local_ca0._0_8_;
    uStack_bf8 = local_ca0._8_8_;
    _local_c70 = vsubps_avx(auVar4,local_ca0);
    local_798 = local_c70;
    local_740 = ::_ps_cephes_exp_C1;
    local_7a8 = local_c50;
    local_720 = local_c50;
    uStack_718 = uStack_c48;
    local_710[0] = 0.6933594;
    local_710[1] = 0.6933594;
    afStack_708[0] = 0.6933594;
    afStack_708[1] = 0.6933594;
    local_700._0_4_ = local_c70._0_4_;
    local_700._4_4_ = local_c70._4_4_;
    uStack_6f8._0_4_ = local_c70._8_4_;
    uStack_6f8._4_4_ = local_c70._12_4_;
    local_730 = (float)local_700 * 0.6933594;
    fStack_72c = local_700._4_4_ * 0.6933594;
    fStack_728 = (float)uStack_6f8 * 0.6933594;
    fStack_724 = uStack_6f8._4_4_ * 0.6933594;
    auVar54._4_4_ = fStack_72c;
    auVar54._0_4_ = local_730;
    auVar54._8_4_ = fStack_728;
    auVar54._12_4_ = fStack_724;
    auVar1 = vsubps_avx(auVar5,auVar54);
    local_7a0 = ::_ps_cephes_exp_C2;
    local_c50 = auVar1._0_8_;
    local_780 = local_c50;
    uStack_c48 = auVar1._8_8_;
    uStack_778 = uStack_c48;
    local_760 = local_c70;
    uStack_758 = uStack_c68;
    local_770[0] = -0.00021219444;
    local_770[1] = -0.00021219444;
    afStack_768[0] = -0.00021219444;
    afStack_768[1] = -0.00021219444;
    local_790 = (float)local_700 * -0.00021219444;
    fStack_78c = local_700._4_4_ * -0.00021219444;
    fStack_788 = (float)uStack_6f8 * -0.00021219444;
    fStack_784 = uStack_6f8._4_4_ * -0.00021219444;
    auVar53._4_4_ = fStack_78c;
    auVar53._0_4_ = local_790;
    auVar53._8_4_ = fStack_788;
    auVar53._12_4_ = fStack_784;
    _local_c50 = vsubps_avx(auVar1,auVar53);
    local_bc0 = local_c50;
    uStack_bb8 = uStack_c48;
    local_bb0._0_4_ = local_c50._0_4_;
    local_bb0._4_4_ = local_c50._4_4_;
    uStack_ba8._0_4_ = local_c50._8_4_;
    uStack_ba8._4_4_ = local_c50._12_4_;
    local_c60 = CONCAT44(local_bb0._4_4_ * local_bb0._4_4_,(float)local_bb0 * (float)local_bb0);
    uStack_c58._0_4_ = (float)uStack_ba8 * (float)uStack_ba8;
    uStack_c58._4_4_ = uStack_ba8._4_4_ * uStack_ba8._4_4_;
    local_318 = &local_cb0;
    local_148 = ::_ps_cephes_exp_p1;
    local_100 = 0x3950696739506967;
    uStack_f8 = 0x3950696739506967;
    local_110 = local_c50;
    uStack_108 = uStack_c48;
    local_120 = (float)local_bb0 * 0.00019875691;
    fStack_11c = local_bb0._4_4_ * 0.00019875691;
    fStack_118 = (float)uStack_ba8 * 0.00019875691;
    fStack_114 = uStack_ba8._4_4_ * 0.00019875691;
    local_130[0] = 0.0013981999;
    local_130[1] = 0.0013981999;
    afStack_128[0] = 0.0013981999;
    afStack_128[1] = 0.0013981999;
    local_cb0 = CONCAT44(fStack_11c + 0.0013981999,local_120 + 0.0013981999);
    uStack_ca8 = CONCAT44(fStack_114 + 0.0013981999,fStack_118 + 0.0013981999);
    local_1a8 = ::_ps_cephes_exp_p2;
    local_160 = local_cb0;
    uStack_158 = uStack_ca8;
    local_170 = local_c50;
    uStack_168 = uStack_c48;
    local_180 = (local_120 + 0.0013981999) * (float)local_bb0;
    fStack_17c = (fStack_11c + 0.0013981999) * local_bb0._4_4_;
    fStack_178 = (fStack_118 + 0.0013981999) * (float)uStack_ba8;
    fStack_174 = (fStack_114 + 0.0013981999) * uStack_ba8._4_4_;
    local_190[0] = 0.008333452;
    local_190[1] = 0.008333452;
    afStack_188[0] = 0.008333452;
    afStack_188[1] = 0.008333452;
    local_cb0 = CONCAT44(fStack_17c + 0.008333452,local_180 + 0.008333452);
    uStack_ca8 = CONCAT44(fStack_174 + 0.008333452,fStack_178 + 0.008333452);
    local_208 = ::_ps_cephes_exp_p3;
    local_1c0 = local_cb0;
    uStack_1b8 = uStack_ca8;
    local_1d0 = local_c50;
    uStack_1c8 = uStack_c48;
    local_1e0 = (local_180 + 0.008333452) * (float)local_bb0;
    fStack_1dc = (fStack_17c + 0.008333452) * local_bb0._4_4_;
    fStack_1d8 = (fStack_178 + 0.008333452) * (float)uStack_ba8;
    fStack_1d4 = (fStack_174 + 0.008333452) * uStack_ba8._4_4_;
    local_1f0[0] = 0.041665796;
    local_1f0[1] = 0.041665796;
    afStack_1e8[0] = 0.041665796;
    afStack_1e8[1] = 0.041665796;
    local_cb0 = CONCAT44(fStack_1dc + 0.041665796,local_1e0 + 0.041665796);
    uStack_ca8 = CONCAT44(fStack_1d4 + 0.041665796,fStack_1d8 + 0.041665796);
    local_268 = ::_ps_cephes_exp_p4;
    local_220 = local_cb0;
    uStack_218 = uStack_ca8;
    local_230 = local_c50;
    uStack_228 = uStack_c48;
    local_240 = (local_1e0 + 0.041665796) * (float)local_bb0;
    fStack_23c = (fStack_1dc + 0.041665796) * local_bb0._4_4_;
    fStack_238 = (fStack_1d8 + 0.041665796) * (float)uStack_ba8;
    fStack_234 = (fStack_1d4 + 0.041665796) * uStack_ba8._4_4_;
    local_250[0] = 0.16666666;
    local_250[1] = 0.16666666;
    afStack_248[0] = 0.16666666;
    afStack_248[1] = 0.16666666;
    local_cb0 = CONCAT44(fStack_23c + 0.16666666,local_240 + 0.16666666);
    uStack_ca8 = CONCAT44(fStack_234 + 0.16666666,fStack_238 + 0.16666666);
    local_2c8 = ::_ps_cephes_exp_p5;
    local_280 = local_cb0;
    uStack_278 = uStack_ca8;
    local_290 = local_c50;
    uStack_288 = uStack_c48;
    local_2a0 = (local_240 + 0.16666666) * (float)local_bb0;
    fStack_29c = (fStack_23c + 0.16666666) * local_bb0._4_4_;
    fStack_298 = (fStack_238 + 0.16666666) * (float)uStack_ba8;
    fStack_294 = (fStack_234 + 0.16666666) * uStack_ba8._4_4_;
    local_2b0[0] = 0.5;
    local_2b0[1] = 0.5;
    afStack_2a8[0] = 0.5;
    afStack_2a8[1] = 0.5;
    local_cb0 = CONCAT44(fStack_29c + 0.5,local_2a0 + 0.5);
    uStack_ca8 = CONCAT44(fStack_294 + 0.5,fStack_298 + 0.5);
    local_320 = &local_c60;
    local_2e0 = local_cb0;
    uStack_2d8 = uStack_ca8;
    local_2f0 = local_c60;
    uStack_2e8 = uStack_c58;
    local_300 = (local_2a0 + 0.5) * (float)local_bb0 * (float)local_bb0;
    fStack_2fc = (fStack_29c + 0.5) * local_bb0._4_4_ * local_bb0._4_4_;
    fStack_2f8 = (fStack_298 + 0.5) * (float)uStack_ba8 * (float)uStack_ba8;
    fStack_2f4 = (fStack_294 + 0.5) * uStack_ba8._4_4_ * uStack_ba8._4_4_;
    local_310 = local_c50;
    uStack_308 = uStack_c48;
    local_cb0 = CONCAT44(fStack_2fc + local_bb0._4_4_,local_300 + (float)local_bb0);
    uStack_ca8 = CONCAT44(fStack_2f4 + uStack_ba8._4_4_,fStack_2f8 + (float)uStack_ba8);
    local_c30 = local_cb0;
    uStack_c28 = uStack_ca8;
    local_c40 = 0x3f8000003f800000;
    uStack_c38 = 0x3f8000003f800000;
    fVar61 = local_300 + (float)local_bb0 + 1.0;
    fVar62 = fStack_2fc + local_bb0._4_4_ + 1.0;
    fVar63 = fStack_2f8 + (float)uStack_ba8 + 1.0;
    fVar64 = fStack_2f4 + uStack_ba8._4_4_ + 1.0;
    local_cb0 = CONCAT44(fVar62,fVar61);
    uStack_ca8 = CONCAT44(fVar64,fVar63);
    local_8f0 = local_c70;
    uStack_8e8 = uStack_c68;
    local_c80._4_4_ = (int)local_700._4_4_;
    local_c80._0_4_ = (int)(float)local_700;
    local_c80._8_4_ = (int)(float)uStack_6f8;
    local_c80._12_4_ = (int)uStack_6f8._4_4_;
    local_b30 = local_c80._0_8_;
    uStack_b28 = local_c80._8_8_;
    auVar42._8_8_ = local_c80._8_8_;
    auVar42._0_8_ = local_c80._0_8_;
    auVar41._8_8_ = 0x7f0000007f;
    auVar41._0_8_ = 0x7f0000007f;
    auVar1 = vpaddd_avx(auVar42,auVar41);
    local_c80._0_8_ = auVar1._0_8_;
    local_b10 = local_c80._0_8_;
    local_c80._8_8_ = auVar1._8_8_;
    uStack_b08 = local_c80._8_8_;
    local_b14 = 0x17;
    local_c80 = vpslld_avx(auVar1,ZEXT416(0x17));
    local_f0 = local_c80._0_8_;
    uStack_e8 = local_c80._8_8_;
    local_cc0 = local_c80._0_8_;
    uStack_cb8 = local_c80._8_8_;
    local_bd0 = local_cb0;
    uStack_bc8 = uStack_ca8;
    local_be0._0_4_ = local_c80._0_4_;
    local_be0._4_4_ = local_c80._4_4_;
    uStack_bd8._0_4_ = local_c80._8_4_;
    uStack_bd8._4_4_ = local_c80._12_4_;
    local_cb0 = CONCAT44(fVar62 * local_be0._4_4_,fVar61 * (float)local_be0);
    uStack_ca8 = CONCAT44(fVar64 * uStack_bd8._4_4_,fVar63 * (float)uStack_bd8);
    local_2718 = local_27a8;
    local_2730 = local_cb0;
    uStack_2728 = uStack_ca8;
    *(undefined8 *)local_27a8 = local_cb0;
    *(undefined8 *)(local_27a8 + 2) = uStack_ca8;
    local_27a0 = (undefined1 (*) [32])(*local_27a0 + 0x10);
    local_27a8 = local_27a8 + 4;
    local_cf0 = local_2850;
    uStack_ce8 = uStack_2848;
    local_ce0 = local_a80;
    uStack_cd8 = uStack_a78;
    local_cd0 = local_d00;
    uStack_cc8 = uStack_cf8;
    local_be0 = local_c80._0_8_;
    uStack_bd8 = local_c80._8_8_;
    local_bb0 = local_bc0;
    uStack_ba8 = uStack_bb8;
    local_b90 = uVar11;
    uStack_b88 = uVar12;
    local_aa0 = local_c90;
    uStack_a98 = uStack_c88;
    local_a70 = local_b00;
    uStack_a68 = uStack_af8;
    local_a50 = local_ae0._0_8_;
    uStack_a48 = local_ae0._8_8_;
    local_a40 = uVar9;
    uStack_a38 = uVar10;
    local_a20 = uVar7;
    uStack_a18 = uVar8;
    local_980 = local_990;
    uStack_978 = uStack_988;
    local_960 = local_2850;
    uStack_958 = uStack_2848;
    local_930 = local_b40;
    uStack_928 = uStack_b38;
    local_748 = local_7a8;
    local_738 = local_798;
    local_700 = local_c70;
    uStack_6f8 = uStack_c68;
    local_688 = local_808;
    local_678 = local_6d8;
    local_640 = local_ac0;
    uStack_638 = uStack_ab8;
    local_620 = local_6e8;
    local_618 = local_808;
    local_5c0 = local_6e8;
    local_5b8 = local_808;
    local_560 = local_6e8;
    local_558 = local_808;
    local_500 = local_6e8;
    local_4f8 = local_808;
    local_4a0 = local_6e8;
    local_498 = local_808;
    local_440 = local_6e8;
    local_438 = local_808;
    local_3e0 = local_6e8;
    local_3d8 = local_808;
    local_380 = local_6e8;
    local_378 = local_808;
    local_328 = local_7a8;
    local_2c0 = local_7a8;
    local_2b8 = local_318;
    local_260 = local_7a8;
    local_258 = local_318;
    local_200 = local_7a8;
    local_1f8 = local_318;
    local_1a0 = local_7a8;
    local_198 = local_318;
    local_140 = local_7a8;
    local_138 = local_318;
    local_d0 = local_2850;
    uStack_c8 = uStack_2848;
    local_90 = local_c20;
    uStack_88 = uStack_c18;
  }
  for (; local_27bc < local_27ac; local_27bc = local_27bc + 1) {
    local_38 = local_27b1;
    local_40 = &local_27b8;
    local_48 = local_27a0;
    fVar61 = powf(*(float *)*local_27a0,local_27b8);
    *local_27a8 = fVar61;
    local_27a0 = (undefined1 (*) [32])(*local_27a0 + 4);
    local_27a8 = local_27a8 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_a(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float a = *ptr;

    int i = 0;
#if __SSE2__
    __m128 _a_128 = (elempack == 4) ? _mm_loadu_ps(ptr) : _mm_set1_ps(a);
#if __AVX__
    __m256 _a_256 = (elempack == 8) ? _mm256_loadu_ps(ptr) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a_128), _a_128, 1);
#if __AVX512F__
    __m512 _a_512 = (elempack == 16) ? _mm512_loadu_ps(ptr) : _mm512_insertf32x8(_mm512_castps256_ps512(_a_256), _a_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_a_512, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_a_256, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_a_128, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(a, *ptr1);
        ptr1 += 1;
        outptr += 1;
    }
}